

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::SubGridIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  Geometry *pGVar8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  RTCRayQueryContext *pRVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  long lVar22;
  size_t k;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [28];
  int iVar88;
  uint uVar89;
  uint uVar90;
  ulong uVar91;
  uint uVar92;
  long lVar93;
  long lVar94;
  undefined8 *puVar95;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  long lVar99;
  long lVar100;
  undefined1 (*pauVar101) [32];
  ulong *puVar102;
  undefined4 uVar103;
  ulong unaff_R14;
  NodeRef root;
  bool bVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar114 [16];
  float fVar127;
  float fVar130;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar128;
  float fVar131;
  float fVar133;
  float fVar134;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar139;
  float fVar160;
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar162;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  __m128 a;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar179 [64];
  __m128 a_1;
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar197;
  undefined1 auVar196 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  float fVar211;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar212 [64];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 in_ZMM14 [64];
  Precalculations pre;
  vfloat<4> lower_y;
  vfloat<4> upper_y;
  vfloat<4> upper_z;
  vfloat<4> lower_z;
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  vfloat<4> lower_x;
  vfloat<4> upper_x;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2f69;
  RayQueryContext *local_2f68;
  undefined1 local_2f60 [32];
  undefined1 local_2f40 [56];
  RayK<8> *local_2f08;
  undefined1 local_2f00 [32];
  RTCFilterFunctionNArguments local_2ed0;
  undefined1 local_2ea0 [32];
  undefined1 local_2e80 [48];
  undefined1 (*local_2e50) [32];
  ulong local_2e48;
  undefined1 local_2e40 [32];
  undefined1 local_2e20 [32];
  undefined1 local_2e00 [32];
  undefined1 local_2de0 [32];
  undefined1 local_2dc0 [32];
  undefined1 local_2da0 [32];
  undefined1 local_2d80 [32];
  undefined1 local_2d60 [16];
  undefined1 local_2d50 [16];
  undefined1 local_2d40 [8];
  float fStack_2d38;
  float fStack_2d34;
  float fStack_2d30;
  float fStack_2d2c;
  float fStack_2d28;
  undefined1 local_2d20 [8];
  float fStack_2d18;
  float fStack_2d14;
  float fStack_2d10;
  float fStack_2d0c;
  float fStack_2d08;
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [32];
  undefined1 local_2ca0 [32];
  BVH *local_2c70;
  Intersectors *local_2c68;
  long local_2c60;
  long local_2c58;
  long local_2c50;
  ulong local_2c48;
  undefined1 local_2c40 [32];
  undefined1 local_2c20 [32];
  undefined1 local_2c00 [32];
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [8];
  float fStack_2bb8;
  float fStack_2bb4;
  float fStack_2bb0;
  float fStack_2bac;
  float fStack_2ba8;
  undefined1 local_2ba0 [32];
  uint local_2b80;
  uint uStack_2b7c;
  uint uStack_2b78;
  uint uStack_2b74;
  uint local_2b70;
  uint uStack_2b6c;
  uint uStack_2b68;
  uint uStack_2b64;
  undefined1 local_2b60 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2b40;
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [8];
  float fStack_2a78;
  float fStack_2a74;
  float fStack_2a70;
  float fStack_2a6c;
  float fStack_2a68;
  undefined1 local_2a60 [8];
  float fStack_2a58;
  float fStack_2a54;
  float fStack_2a50;
  float fStack_2a4c;
  float fStack_2a48;
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  RTCHitN local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined4 local_28e0;
  undefined4 uStack_28dc;
  undefined4 uStack_28d8;
  undefined4 uStack_28d4;
  undefined4 uStack_28d0;
  undefined4 uStack_28cc;
  undefined4 uStack_28c8;
  undefined4 uStack_28c4;
  uint local_28c0;
  uint uStack_28bc;
  uint uStack_28b8;
  uint uStack_28b4;
  uint uStack_28b0;
  uint uStack_28ac;
  uint uStack_28a8;
  uint uStack_28a4;
  uint local_28a0;
  uint uStack_289c;
  uint uStack_2898;
  uint uStack_2894;
  uint uStack_2890;
  uint uStack_288c;
  uint uStack_2888;
  uint uStack_2884;
  uint local_2880;
  uint uStack_287c;
  uint uStack_2878;
  uint uStack_2874;
  uint uStack_2870;
  uint uStack_286c;
  uint uStack_2868;
  uint uStack_2864;
  undefined1 local_2860 [16];
  undefined8 local_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 local_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 local_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 local_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 local_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 local_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 local_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 local_2770;
  undefined8 uStack_2768;
  undefined1 local_2760 [32];
  undefined4 local_2740;
  undefined4 uStack_273c;
  undefined4 uStack_2738;
  undefined4 uStack_2734;
  undefined4 uStack_2730;
  undefined4 uStack_272c;
  undefined4 uStack_2728;
  undefined4 uStack_2724;
  undefined4 local_2720;
  undefined4 uStack_271c;
  undefined4 uStack_2718;
  undefined4 uStack_2714;
  undefined4 uStack_2710;
  undefined4 uStack_270c;
  undefined4 uStack_2708;
  undefined4 uStack_2704;
  undefined4 local_2700;
  undefined4 uStack_26fc;
  undefined4 uStack_26f8;
  undefined4 uStack_26f4;
  undefined4 uStack_26f0;
  undefined4 uStack_26ec;
  undefined4 uStack_26e8;
  undefined4 uStack_26e4;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar118 [32];
  float fVar129;
  float fVar132;
  float fVar135;
  
  local_2608 = (((BVH *)This->ptr)->root).ptr;
  if (local_2608 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar126 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar107 = ZEXT816(0) << 0x40;
      auVar184 = vpcmpeqd_avx2(auVar126,(undefined1  [32])valid_i->field_0);
      auVar126 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar107),5);
      auVar144 = auVar184 & auVar126;
      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar144 >> 0x7f,0) != '\0') ||
            (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar144 >> 0xbf,0) != '\0') ||
          (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar144[0x1f] < '\0') {
        auVar126 = vandps_avx(auVar126,auVar184);
        auVar140 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
        auVar179 = ZEXT1664(auVar140);
        local_2b40._0_8_ = *(undefined8 *)ray;
        local_2b40._8_8_ = *(undefined8 *)(ray + 8);
        local_2b40._16_8_ = *(undefined8 *)(ray + 0x10);
        local_2b40._24_8_ = *(undefined8 *)(ray + 0x18);
        local_2b40._32_8_ = *(undefined8 *)(ray + 0x20);
        local_2b40._40_8_ = *(undefined8 *)(ray + 0x28);
        local_2b40._48_8_ = *(undefined8 *)(ray + 0x30);
        local_2b40._56_8_ = *(undefined8 *)(ray + 0x38);
        local_2b40._64_8_ = *(undefined8 *)(ray + 0x40);
        local_2b40._72_8_ = *(undefined8 *)(ray + 0x48);
        local_2b40._80_8_ = *(undefined8 *)(ray + 0x50);
        local_2b40._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2ae0 = *(undefined1 (*) [32])(ray + 0x80);
        local_2ac0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_2b60._8_4_ = 0x7fffffff;
        local_2b60._0_8_ = 0x7fffffff7fffffff;
        local_2b60._12_4_ = 0x7fffffff;
        local_2b60._16_4_ = 0x7fffffff;
        local_2b60._20_4_ = 0x7fffffff;
        local_2b60._24_4_ = 0x7fffffff;
        local_2b60._28_4_ = 0x7fffffff;
        auVar125._8_4_ = 0x219392ef;
        auVar125._0_8_ = 0x219392ef219392ef;
        auVar125._12_4_ = 0x219392ef;
        auVar125._16_4_ = 0x219392ef;
        auVar125._20_4_ = 0x219392ef;
        auVar125._24_4_ = 0x219392ef;
        auVar125._28_4_ = 0x219392ef;
        auVar209 = ZEXT3264(auVar125);
        auVar183._8_4_ = 0x3f800000;
        auVar183._0_8_ = 0x3f8000003f800000;
        auVar183._12_4_ = 0x3f800000;
        auVar183._16_4_ = 0x3f800000;
        auVar183._20_4_ = 0x3f800000;
        auVar183._24_4_ = 0x3f800000;
        auVar183._28_4_ = 0x3f800000;
        local_2aa0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar119 = vdivps_avx(auVar183,local_2ae0);
        auVar126 = vandps_avx(local_2b60,local_2ae0);
        auVar144 = vcmpps_avx(auVar126,auVar125,1);
        auVar126 = vandps_avx(local_2b60,local_2ac0);
        auVar184 = vcmpps_avx(auVar126,auVar125,1);
        auVar193 = vdivps_avx(auVar183,local_2ac0);
        auVar126 = vandps_avx(local_2b60,local_2aa0);
        auVar118._8_4_ = 0x5d5e0b6b;
        auVar118._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar118._12_4_ = 0x5d5e0b6b;
        auVar118._16_4_ = 0x5d5e0b6b;
        auVar118._20_4_ = 0x5d5e0b6b;
        auVar118._24_4_ = 0x5d5e0b6b;
        auVar118._28_4_ = 0x5d5e0b6b;
        _local_2a80 = vblendvps_avx(auVar119,auVar118,auVar144);
        auVar126 = vcmpps_avx(auVar126,auVar125,1);
        auVar144 = vdivps_avx(auVar183,local_2aa0);
        auVar205 = ZEXT3264(auVar144);
        _local_2a60 = vblendvps_avx(auVar193,auVar118,auVar184);
        local_2a40 = vblendvps_avx(auVar144,auVar118,auVar126);
        auVar200 = ZEXT3264(local_2a40);
        auVar126 = vcmpps_avx(_local_2a80,ZEXT1632(auVar107),1);
        auVar193._8_4_ = 0x10;
        auVar193._0_8_ = 0x1000000010;
        auVar193._12_4_ = 0x10;
        auVar193._16_4_ = 0x10;
        auVar193._20_4_ = 0x10;
        auVar193._24_4_ = 0x10;
        auVar193._28_4_ = 0x10;
        local_2a20 = vandps_avx(auVar126,auVar193);
        auVar144 = ZEXT1632(auVar107);
        auVar126 = vcmpps_avx(_local_2a60,auVar144,5);
        auVar184._8_4_ = 0x20;
        auVar184._0_8_ = 0x2000000020;
        auVar184._12_4_ = 0x20;
        auVar184._16_4_ = 0x20;
        auVar184._20_4_ = 0x20;
        auVar184._24_4_ = 0x20;
        auVar184._28_4_ = 0x20;
        auVar194._8_4_ = 0x30;
        auVar194._0_8_ = 0x3000000030;
        auVar194._12_4_ = 0x30;
        auVar194._16_4_ = 0x30;
        auVar194._20_4_ = 0x30;
        auVar194._24_4_ = 0x30;
        auVar194._28_4_ = 0x30;
        local_2a00 = vblendvps_avx(auVar194,auVar184,auVar126);
        auVar126 = vcmpps_avx(local_2a40,auVar144,5);
        auVar119._8_4_ = 0x40;
        auVar119._0_8_ = 0x4000000040;
        auVar119._12_4_ = 0x40;
        auVar119._16_4_ = 0x40;
        auVar119._20_4_ = 0x40;
        auVar119._24_4_ = 0x40;
        auVar119._28_4_ = 0x40;
        auVar120._8_4_ = 0x50;
        auVar120._0_8_ = 0x5000000050;
        auVar120._12_4_ = 0x50;
        auVar120._16_4_ = 0x50;
        auVar120._20_4_ = 0x50;
        auVar120._24_4_ = 0x50;
        auVar120._28_4_ = 0x50;
        local_29e0 = vblendvps_avx(auVar120,auVar119,auVar126);
        auVar126 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar144);
        local_2760 = vpmovsxwd_avx2(auVar140);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar212 = ZEXT3264(local_1e80);
        local_29c0 = vblendvps_avx(local_1e80,auVar126,local_2760);
        auVar126 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar144);
        auVar144._8_4_ = 0xff800000;
        auVar144._0_8_ = 0xff800000ff800000;
        auVar144._12_4_ = 0xff800000;
        auVar144._16_4_ = 0xff800000;
        auVar144._20_4_ = 0xff800000;
        auVar144._24_4_ = 0xff800000;
        auVar144._28_4_ = 0xff800000;
        local_29a0 = vblendvps_avx(auVar144,auVar126,local_2760);
        auVar107 = vpcmpeqd_avx(local_29a0._0_16_,local_29a0._0_16_);
        local_2c40 = vpmovsxwd_avx2(auVar140 ^ auVar107);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar98 = 5;
        }
        else {
          uVar98 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2c70 = (BVH *)This->ptr;
        local_2c68 = This;
        local_2f08 = ray + 0x100;
        puVar102 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar101 = (undefined1 (*) [32])local_1e40;
        local_1e60 = local_29c0;
        local_2e50 = (undefined1 (*) [32])&local_28a0;
        local_2e48 = uVar98;
        local_2f68 = context;
LAB_019d7d27:
        do {
          do {
            root.ptr = puVar102[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_019d9851;
            puVar102 = puVar102 + -1;
            pauVar101 = pauVar101 + -1;
            local_2f60 = *pauVar101;
            auVar159 = ZEXT3264(local_2f60);
            auVar126 = vcmpps_avx(local_2f60,local_29a0,1);
          } while ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar126 >> 0x7f,0) == '\0') &&
                     (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar126 >> 0xbf,0) == '\0') &&
                   (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar126[0x1f]);
          uVar103 = vmovmskps_avx(auVar126);
          unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar103);
          if (uVar98 < (uint)POPCOUNT(uVar103)) {
LAB_019d7d66:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_019d9851;
                auVar144 = auVar159._0_32_;
                auVar126 = vcmpps_avx(local_29a0,auVar144,6);
                if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar126 >> 0x7f,0) != '\0') ||
                      (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar126 >> 0xbf,0) != '\0') ||
                    (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar126[0x1f] < '\0') {
                  auVar126 = vpcmpeqd_avx2(auVar144,auVar144);
                  local_2c60 = (ulong)((uint)root.ptr & 0xf) - 8;
                  if (local_2c60 == 0) {
                    auVar126 = vpcmpeqd_avx2(auVar179._0_32_,auVar179._0_32_);
                    auVar144 = local_2c40;
                  }
                  else {
                    uVar96 = root.ptr & 0xfffffffffffffff0;
                    local_2c20 = local_2c40 ^ auVar126;
                    lVar93 = 0;
                    do {
                      local_2c58 = lVar93;
                      lVar93 = lVar93 * 0x58;
                      auVar107._8_8_ = 0;
                      auVar107._0_8_ = *(ulong *)(uVar96 + 0x20 + lVar93);
                      auVar140._8_8_ = 0;
                      auVar140._0_8_ = *(ulong *)(uVar96 + 0x24 + lVar93);
                      auVar140 = vpminub_avx(auVar107,auVar140);
                      auVar107 = vpcmpeqb_avx(auVar107,auVar140);
                      auVar140 = vpcmpeqd_avx(auVar140,auVar140);
                      auVar107 = vpmovzxbd_avx(auVar107 ^ auVar140);
                      auVar107 = vpslld_avx(auVar107 ^ auVar140,0x1f);
                      uVar89 = vmovmskps_avx(auVar107);
                      if (uVar89 != 0) {
                        lVar93 = lVar93 + uVar96;
                        uVar97 = (ulong)(uVar89 & 0xff);
                        local_2c50 = lVar93;
                        do {
                          lVar22 = 0;
                          for (uVar91 = uVar97; (uVar91 & 1) == 0;
                              uVar91 = uVar91 >> 1 | 0x8000000000000000) {
                            lVar22 = lVar22 + 1;
                          }
                          auVar108._8_8_ = 0;
                          auVar108._0_8_ = *(ulong *)(lVar93 + 0x20);
                          auVar107 = vpmovzxbd_avx(auVar108);
                          auVar107 = vcvtdq2ps_avx(auVar107);
                          uVar103 = *(undefined4 *)(lVar93 + 0x44);
                          auVar141._4_4_ = uVar103;
                          auVar141._0_4_ = uVar103;
                          auVar141._8_4_ = uVar103;
                          auVar141._12_4_ = uVar103;
                          uVar103 = *(undefined4 *)(lVar93 + 0x38);
                          auVar166._4_4_ = uVar103;
                          auVar166._0_4_ = uVar103;
                          auVar166._8_4_ = uVar103;
                          auVar166._12_4_ = uVar103;
                          auVar107 = vfmadd213ps_fma(auVar107,auVar141,auVar166);
                          local_2980[0] = (RTCHitN)auVar107[0];
                          local_2980[1] = (RTCHitN)auVar107[1];
                          local_2980[2] = (RTCHitN)auVar107[2];
                          local_2980[3] = (RTCHitN)auVar107[3];
                          local_2980[4] = (RTCHitN)auVar107[4];
                          local_2980[5] = (RTCHitN)auVar107[5];
                          local_2980[6] = (RTCHitN)auVar107[6];
                          local_2980[7] = (RTCHitN)auVar107[7];
                          local_2980[8] = (RTCHitN)auVar107[8];
                          local_2980[9] = (RTCHitN)auVar107[9];
                          local_2980[10] = (RTCHitN)auVar107[10];
                          local_2980[0xb] = (RTCHitN)auVar107[0xb];
                          local_2980[0xc] = (RTCHitN)auVar107[0xc];
                          local_2980[0xd] = (RTCHitN)auVar107[0xd];
                          local_2980[0xe] = (RTCHitN)auVar107[0xe];
                          local_2980[0xf] = (RTCHitN)auVar107[0xf];
                          auVar109._8_8_ = 0;
                          auVar109._0_8_ = *(ulong *)(lVar93 + 0x24);
                          auVar107 = vpmovzxbd_avx(auVar109);
                          auVar107 = vcvtdq2ps_avx(auVar107);
                          local_2860 = vfmadd213ps_fma(auVar107,auVar141,auVar166);
                          auVar110._8_8_ = 0;
                          auVar110._0_8_ = *(ulong *)(lVar93 + 0x28);
                          auVar107 = vpmovzxbd_avx(auVar110);
                          auVar107 = vcvtdq2ps_avx(auVar107);
                          uVar103 = *(undefined4 *)(lVar93 + 0x48);
                          auVar142._4_4_ = uVar103;
                          auVar142._0_4_ = uVar103;
                          auVar142._8_4_ = uVar103;
                          auVar142._12_4_ = uVar103;
                          uVar103 = *(undefined4 *)(lVar93 + 0x3c);
                          auVar167._4_4_ = uVar103;
                          auVar167._0_4_ = uVar103;
                          auVar167._8_4_ = uVar103;
                          auVar167._12_4_ = uVar103;
                          auVar107 = vfmadd213ps_fma(auVar107,auVar142,auVar167);
                          local_2ed0.valid = (int *)auVar107._0_8_;
                          local_2ed0.geometryUserPtr = (void *)auVar107._8_8_;
                          auVar111._8_8_ = 0;
                          auVar111._0_8_ = *(ulong *)(lVar93 + 0x2c);
                          auVar107 = vpmovzxbd_avx(auVar111);
                          auVar107 = vcvtdq2ps_avx(auVar107);
                          auVar107 = vfmadd213ps_fma(auVar107,auVar142,auVar167);
                          local_2d80._0_16_ = auVar107;
                          auVar112._8_8_ = 0;
                          auVar112._0_8_ = *(ulong *)(lVar93 + 0x30);
                          auVar107 = vpmovzxbd_avx(auVar112);
                          auVar107 = vcvtdq2ps_avx(auVar107);
                          uVar103 = *(undefined4 *)(lVar93 + 0x4c);
                          auVar143._4_4_ = uVar103;
                          auVar143._0_4_ = uVar103;
                          auVar143._8_4_ = uVar103;
                          auVar143._12_4_ = uVar103;
                          uVar103 = *(undefined4 *)(lVar93 + 0x40);
                          auVar168._4_4_ = uVar103;
                          auVar168._0_4_ = uVar103;
                          auVar168._8_4_ = uVar103;
                          auVar168._12_4_ = uVar103;
                          local_2d50 = vfmadd213ps_fma(auVar107,auVar143,auVar168);
                          auVar113._8_8_ = 0;
                          auVar113._0_8_ = *(ulong *)(lVar93 + 0x34);
                          auVar107 = vpmovzxbd_avx(auVar113);
                          auVar107 = vcvtdq2ps_avx(auVar107);
                          local_2d60 = vfmadd213ps_fma(auVar107,auVar143,auVar168);
                          uVar91 = (ulong)(uint)((int)lVar22 * 4);
                          uVar103 = *(undefined4 *)(local_2980 + uVar91);
                          auVar115._4_4_ = uVar103;
                          auVar115._0_4_ = uVar103;
                          auVar115._8_4_ = uVar103;
                          auVar115._12_4_ = uVar103;
                          auVar115._16_4_ = uVar103;
                          auVar115._20_4_ = uVar103;
                          auVar115._24_4_ = uVar103;
                          auVar115._28_4_ = uVar103;
                          auVar79._8_8_ = local_2b40._8_8_;
                          auVar79._0_8_ = local_2b40._0_8_;
                          auVar79._16_8_ = local_2b40._16_8_;
                          auVar79._24_8_ = local_2b40._24_8_;
                          auVar81._8_8_ = local_2b40._40_8_;
                          auVar81._0_8_ = local_2b40._32_8_;
                          auVar81._16_8_ = local_2b40._48_8_;
                          auVar81._24_8_ = local_2b40._56_8_;
                          auVar83._8_8_ = local_2b40._72_8_;
                          auVar83._0_8_ = local_2b40._64_8_;
                          auVar83._16_8_ = local_2b40._80_8_;
                          auVar83._24_8_ = local_2b40._88_8_;
                          auVar126 = vsubps_avx(auVar115,auVar79);
                          auVar25._4_4_ = (float)local_2a80._4_4_ * auVar126._4_4_;
                          auVar25._0_4_ = (float)local_2a80._0_4_ * auVar126._0_4_;
                          auVar25._8_4_ = fStack_2a78 * auVar126._8_4_;
                          auVar25._12_4_ = fStack_2a74 * auVar126._12_4_;
                          auVar25._16_4_ = fStack_2a70 * auVar126._16_4_;
                          auVar25._20_4_ = fStack_2a6c * auVar126._20_4_;
                          auVar25._24_4_ = fStack_2a68 * auVar126._24_4_;
                          auVar25._28_4_ = auVar126._28_4_;
                          uVar103 = *(undefined4 *)((long)&local_2ed0.valid + uVar91);
                          auVar195._4_4_ = uVar103;
                          auVar195._0_4_ = uVar103;
                          auVar195._8_4_ = uVar103;
                          auVar195._12_4_ = uVar103;
                          auVar195._16_4_ = uVar103;
                          auVar195._20_4_ = uVar103;
                          auVar195._24_4_ = uVar103;
                          auVar195._28_4_ = uVar103;
                          auVar126 = vsubps_avx(auVar195,auVar81);
                          auVar26._4_4_ = (float)local_2a60._4_4_ * auVar126._4_4_;
                          auVar26._0_4_ = (float)local_2a60._0_4_ * auVar126._0_4_;
                          auVar26._8_4_ = fStack_2a58 * auVar126._8_4_;
                          auVar26._12_4_ = fStack_2a54 * auVar126._12_4_;
                          auVar26._16_4_ = fStack_2a50 * auVar126._16_4_;
                          auVar26._20_4_ = fStack_2a4c * auVar126._20_4_;
                          auVar26._24_4_ = fStack_2a48 * auVar126._24_4_;
                          auVar26._28_4_ = auVar126._28_4_;
                          uVar103 = *(undefined4 *)(local_2d50 + uVar91);
                          auVar201._4_4_ = uVar103;
                          auVar201._0_4_ = uVar103;
                          auVar201._8_4_ = uVar103;
                          auVar201._12_4_ = uVar103;
                          auVar201._16_4_ = uVar103;
                          auVar201._20_4_ = uVar103;
                          auVar201._24_4_ = uVar103;
                          auVar201._28_4_ = uVar103;
                          auVar126 = vsubps_avx(auVar201,auVar83);
                          auVar205 = ZEXT3264(local_2a40);
                          auVar27._4_4_ = local_2a40._4_4_ * auVar126._4_4_;
                          auVar27._0_4_ = local_2a40._0_4_ * auVar126._0_4_;
                          auVar27._8_4_ = local_2a40._8_4_ * auVar126._8_4_;
                          auVar27._12_4_ = local_2a40._12_4_ * auVar126._12_4_;
                          auVar27._16_4_ = local_2a40._16_4_ * auVar126._16_4_;
                          auVar27._20_4_ = local_2a40._20_4_ * auVar126._20_4_;
                          auVar27._24_4_ = local_2a40._24_4_ * auVar126._24_4_;
                          auVar27._28_4_ = auVar126._28_4_;
                          uVar103 = *(undefined4 *)(local_2860 + uVar91);
                          auVar206._4_4_ = uVar103;
                          auVar206._0_4_ = uVar103;
                          auVar206._8_4_ = uVar103;
                          auVar206._12_4_ = uVar103;
                          auVar206._16_4_ = uVar103;
                          auVar206._20_4_ = uVar103;
                          auVar206._24_4_ = uVar103;
                          auVar206._28_4_ = uVar103;
                          auVar126 = vsubps_avx(auVar206,auVar79);
                          auVar28._4_4_ = (float)local_2a80._4_4_ * auVar126._4_4_;
                          auVar28._0_4_ = (float)local_2a80._0_4_ * auVar126._0_4_;
                          auVar28._8_4_ = fStack_2a78 * auVar126._8_4_;
                          auVar28._12_4_ = fStack_2a74 * auVar126._12_4_;
                          auVar28._16_4_ = fStack_2a70 * auVar126._16_4_;
                          auVar28._20_4_ = fStack_2a6c * auVar126._20_4_;
                          auVar28._24_4_ = fStack_2a68 * auVar126._24_4_;
                          auVar28._28_4_ = auVar126._28_4_;
                          uVar103 = *(undefined4 *)(local_2d80 + uVar91);
                          auVar185._4_4_ = uVar103;
                          auVar185._0_4_ = uVar103;
                          auVar185._8_4_ = uVar103;
                          auVar185._12_4_ = uVar103;
                          auVar185._16_4_ = uVar103;
                          auVar185._20_4_ = uVar103;
                          auVar185._24_4_ = uVar103;
                          auVar185._28_4_ = uVar103;
                          auVar126 = vsubps_avx(auVar185,auVar81);
                          auVar29._4_4_ = (float)local_2a60._4_4_ * auVar126._4_4_;
                          auVar29._0_4_ = (float)local_2a60._0_4_ * auVar126._0_4_;
                          auVar29._8_4_ = fStack_2a58 * auVar126._8_4_;
                          auVar29._12_4_ = fStack_2a54 * auVar126._12_4_;
                          auVar29._16_4_ = fStack_2a50 * auVar126._16_4_;
                          auVar29._20_4_ = fStack_2a4c * auVar126._20_4_;
                          auVar29._24_4_ = fStack_2a48 * auVar126._24_4_;
                          auVar29._28_4_ = auVar126._28_4_;
                          auVar179 = ZEXT3264(auVar29);
                          uVar103 = *(undefined4 *)(local_2d60 + uVar91);
                          auVar186._4_4_ = uVar103;
                          auVar186._0_4_ = uVar103;
                          auVar186._8_4_ = uVar103;
                          auVar186._12_4_ = uVar103;
                          auVar186._16_4_ = uVar103;
                          auVar186._20_4_ = uVar103;
                          auVar186._24_4_ = uVar103;
                          auVar186._28_4_ = uVar103;
                          auVar126 = vsubps_avx(auVar186,auVar83);
                          auVar30._4_4_ = local_2a40._4_4_ * auVar126._4_4_;
                          auVar30._0_4_ = local_2a40._0_4_ * auVar126._0_4_;
                          auVar30._8_4_ = local_2a40._8_4_ * auVar126._8_4_;
                          auVar30._12_4_ = local_2a40._12_4_ * auVar126._12_4_;
                          auVar30._16_4_ = local_2a40._16_4_ * auVar126._16_4_;
                          auVar30._20_4_ = local_2a40._20_4_ * auVar126._20_4_;
                          auVar30._24_4_ = local_2a40._24_4_ * auVar126._24_4_;
                          auVar30._28_4_ = auVar126._28_4_;
                          auVar126 = vminps_avx(auVar25,auVar28);
                          auVar144 = vminps_avx(auVar26,auVar29);
                          auVar126 = vmaxps_avx(auVar126,auVar144);
                          auVar144 = vminps_avx(auVar27,auVar30);
                          auVar200 = ZEXT3264(auVar144);
                          auVar126 = vmaxps_avx(auVar126,auVar144);
                          auVar31._4_4_ = auVar126._4_4_ * 0.99999964;
                          auVar31._0_4_ = auVar126._0_4_ * 0.99999964;
                          auVar31._8_4_ = auVar126._8_4_ * 0.99999964;
                          auVar31._12_4_ = auVar126._12_4_ * 0.99999964;
                          auVar31._16_4_ = auVar126._16_4_ * 0.99999964;
                          auVar31._20_4_ = auVar126._20_4_ * 0.99999964;
                          auVar31._24_4_ = auVar126._24_4_ * 0.99999964;
                          auVar31._28_4_ = auVar126._28_4_;
                          auVar126 = vmaxps_avx(auVar25,auVar28);
                          auVar144 = vmaxps_avx(auVar26,auVar29);
                          auVar144 = vminps_avx(auVar126,auVar144);
                          auVar126 = vmaxps_avx(auVar27,auVar30);
                          auVar126 = vminps_avx(auVar144,auVar126);
                          auVar32._4_4_ = auVar126._4_4_ * 1.0000004;
                          auVar32._0_4_ = auVar126._0_4_ * 1.0000004;
                          auVar32._8_4_ = auVar126._8_4_ * 1.0000004;
                          auVar32._12_4_ = auVar126._12_4_ * 1.0000004;
                          auVar32._16_4_ = auVar126._16_4_ * 1.0000004;
                          auVar32._20_4_ = auVar126._20_4_ * 1.0000004;
                          auVar32._24_4_ = auVar126._24_4_ * 1.0000004;
                          auVar32._28_4_ = auVar126._28_4_;
                          auVar126 = vmaxps_avx(auVar31,local_29c0);
                          auVar144 = vminps_avx(auVar32,local_29a0);
                          auVar126 = vcmpps_avx(auVar126,auVar144,2);
                          auVar126 = local_2c20 & auVar126;
                          if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar126 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar126 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar126 >> 0x7f,0) == '\0') &&
                                (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar126 >> 0xbf,0) == '\0') &&
                              (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar126[0x1f]) {
                            bVar104 = false;
                          }
                          else {
                            local_2c48 = uVar97;
                            uVar5 = *(ushort *)(lVar93 + lVar22 * 8);
                            uVar6 = *(ushort *)(lVar93 + 2 + lVar22 * 8);
                            local_2b70 = *(uint *)(lVar93 + 0x50);
                            local_2b80 = *(uint *)(lVar93 + 4 + lVar22 * 8);
                            pGVar8 = (context->scene->geometries).items[local_2b70].ptr;
                            lVar22 = *(long *)&pGVar8->field_0x58;
                            lVar9 = *(long *)&pGVar8[1].time_range.upper;
                            lVar99 = (ulong)local_2b80 *
                                     pGVar8[1].super_RefCount.refCounter.
                                     super___atomic_base<unsigned_long>._M_i;
                            uVar90 = uVar5 & 0x7fff;
                            uVar92 = uVar6 & 0x7fff;
                            uVar89 = *(uint *)(lVar22 + 4 + lVar99);
                            uVar97 = (ulong)uVar89;
                            uVar91 = (ulong)(uVar89 * uVar92 + *(int *)(lVar22 + lVar99) + uVar90);
                            p_Var10 = pGVar8[1].intersectionFilterN;
                            auVar209 = ZEXT3264(local_2c20);
                            puVar95 = (undefined8 *)(lVar9 + (uVar91 + 1) * (long)p_Var10);
                            local_2850 = *puVar95;
                            uStack_2848 = puVar95[1];
                            lVar93 = uVar91 + uVar97;
                            puVar95 = (undefined8 *)(lVar9 + lVar93 * (long)p_Var10);
                            local_2830 = *puVar95;
                            uStack_2828 = puVar95[1];
                            lVar100 = uVar91 + uVar97 + 1;
                            puVar95 = (undefined8 *)(lVar9 + lVar100 * (long)p_Var10);
                            local_2840 = *puVar95;
                            uStack_2838 = puVar95[1];
                            uVar98 = (ulong)(-1 < (short)uVar5);
                            puVar95 = (undefined8 *)(lVar9 + (uVar91 + uVar98 + 1) * (long)p_Var10);
                            lVar94 = uVar98 + lVar100;
                            puVar2 = (undefined8 *)(lVar9 + lVar94 * (long)p_Var10);
                            local_2800 = *puVar2;
                            uStack_27f8 = puVar2[1];
                            if ((short)uVar6 < 0) {
                              uVar97 = 0;
                            }
                            puVar2 = (undefined8 *)(lVar9 + (lVar93 + uVar97) * (long)p_Var10);
                            puVar3 = (undefined8 *)(lVar9 + (lVar100 + uVar97) * (long)p_Var10);
                            local_27c0 = *puVar3;
                            uStack_27b8 = puVar3[1];
                            puVar3 = (undefined8 *)(lVar9 + (uVar97 + lVar94) * (long)p_Var10);
                            local_2860 = *(undefined1 (*) [16])(lVar9 + (long)p_Var10 * uVar91);
                            local_2820 = local_2850;
                            uStack_2818 = uStack_2848;
                            local_2810 = *puVar95;
                            uStack_2808 = puVar95[1];
                            local_27f0 = local_2840;
                            uStack_27e8 = uStack_2838;
                            local_27e0 = local_2830;
                            uStack_27d8 = uStack_2828;
                            local_27d0 = local_2840;
                            uStack_27c8 = uStack_2838;
                            local_27b0 = *puVar2;
                            uStack_27a8 = puVar2[1];
                            local_27a0 = local_2840;
                            uStack_2798 = uStack_2838;
                            local_2790 = local_2800;
                            uStack_2788 = uStack_27f8;
                            local_2780 = *puVar3;
                            uStack_2778 = puVar3[1];
                            local_2770 = local_27c0;
                            uStack_2768 = uStack_27b8;
                            uStack_2b6c = local_2b70;
                            uStack_2b68 = local_2b70;
                            uStack_2b64 = local_2b70;
                            uStack_2b7c = local_2b80;
                            uStack_2b78 = local_2b80;
                            uStack_2b74 = local_2b80;
                            puVar95 = &uStack_2828;
                            unaff_R14 = 0;
                            context = local_2f68;
                            do {
                              auVar184 = auVar209._0_32_;
                              uVar103 = *(undefined4 *)(puVar95 + -7);
                              auVar116._4_4_ = uVar103;
                              auVar116._0_4_ = uVar103;
                              auVar116._8_4_ = uVar103;
                              auVar116._12_4_ = uVar103;
                              auVar116._16_4_ = uVar103;
                              auVar116._20_4_ = uVar103;
                              auVar116._24_4_ = uVar103;
                              auVar116._28_4_ = uVar103;
                              uVar103 = *(undefined4 *)((long)puVar95 + -0x34);
                              auVar151._4_4_ = uVar103;
                              auVar151._0_4_ = uVar103;
                              auVar151._8_4_ = uVar103;
                              auVar151._12_4_ = uVar103;
                              auVar151._16_4_ = uVar103;
                              auVar151._20_4_ = uVar103;
                              auVar151._24_4_ = uVar103;
                              auVar151._28_4_ = uVar103;
                              uVar103 = *(undefined4 *)(puVar95 + -6);
                              auVar169._4_4_ = uVar103;
                              auVar169._0_4_ = uVar103;
                              auVar169._8_4_ = uVar103;
                              auVar169._12_4_ = uVar103;
                              auVar169._16_4_ = uVar103;
                              auVar169._20_4_ = uVar103;
                              auVar169._24_4_ = uVar103;
                              auVar169._28_4_ = uVar103;
                              uVar103 = *(undefined4 *)(puVar95 + -1);
                              local_2640._4_4_ = uVar103;
                              local_2640._0_4_ = uVar103;
                              local_2640._8_4_ = uVar103;
                              local_2640._12_4_ = uVar103;
                              local_2640._16_4_ = uVar103;
                              local_2640._20_4_ = uVar103;
                              local_2640._24_4_ = uVar103;
                              local_2640._28_4_ = uVar103;
                              uVar4 = *(undefined4 *)((long)puVar95 + -4);
                              local_2660._4_4_ = uVar4;
                              local_2660._0_4_ = uVar4;
                              local_2660._8_4_ = uVar4;
                              local_2660._12_4_ = uVar4;
                              local_2660._16_4_ = uVar4;
                              local_2660._20_4_ = uVar4;
                              local_2660._24_4_ = uVar4;
                              local_2660._28_4_ = uVar4;
                              uVar4 = *(undefined4 *)puVar95;
                              local_2680._4_4_ = uVar4;
                              local_2680._0_4_ = uVar4;
                              local_2680._8_4_ = uVar4;
                              local_2680._12_4_ = uVar4;
                              local_2680._16_4_ = uVar4;
                              local_2680._20_4_ = uVar4;
                              local_2680._24_4_ = uVar4;
                              local_2680._28_4_ = uVar4;
                              local_2d50._4_4_ = uStack_2b6c;
                              local_2d50._0_4_ = local_2b70;
                              local_2d50._12_4_ = uStack_2b64;
                              local_2d50._8_4_ = uStack_2b68;
                              local_2d60._4_4_ = uStack_2b7c;
                              local_2d60._0_4_ = local_2b80;
                              local_2d60._12_4_ = uStack_2b74;
                              local_2d60._8_4_ = uStack_2b78;
                              auVar126 = *(undefined1 (*) [32])ray;
                              local_2da0 = *(undefined1 (*) [32])(ray + 0x20);
                              auVar144 = *(undefined1 (*) [32])(ray + 0x40);
                              local_2e80._0_32_ = vsubps_avx(auVar116,auVar126);
                              local_2d00 = vsubps_avx(auVar151,local_2da0);
                              local_2ca0 = vsubps_avx(auVar169,auVar144);
                              auVar119 = vsubps_avx(local_2660,local_2da0);
                              local_2e20 = vsubps_avx(local_2680,auVar144);
                              local_2e40 = vsubps_avx(auVar119,local_2d00);
                              local_2ea0 = vsubps_avx(local_2e20,local_2ca0);
                              auVar198._0_4_ = auVar119._0_4_ + local_2d00._0_4_;
                              auVar198._4_4_ = auVar119._4_4_ + local_2d00._4_4_;
                              auVar198._8_4_ = auVar119._8_4_ + local_2d00._8_4_;
                              auVar198._12_4_ = auVar119._12_4_ + local_2d00._12_4_;
                              auVar198._16_4_ = auVar119._16_4_ + local_2d00._16_4_;
                              auVar198._20_4_ = auVar119._20_4_ + local_2d00._20_4_;
                              auVar198._24_4_ = auVar119._24_4_ + local_2d00._24_4_;
                              auVar198._28_4_ = auVar119._28_4_ + local_2d00._28_4_;
                              fVar139 = local_2ca0._0_4_;
                              auVar202._0_4_ = local_2e20._0_4_ + fVar139;
                              fVar129 = local_2ca0._4_4_;
                              auVar202._4_4_ = local_2e20._4_4_ + fVar129;
                              fVar132 = local_2ca0._8_4_;
                              auVar202._8_4_ = local_2e20._8_4_ + fVar132;
                              fVar135 = local_2ca0._12_4_;
                              auVar202._12_4_ = local_2e20._12_4_ + fVar135;
                              fVar12 = local_2ca0._16_4_;
                              auVar202._16_4_ = local_2e20._16_4_ + fVar12;
                              fVar13 = local_2ca0._20_4_;
                              auVar202._20_4_ = local_2e20._20_4_ + fVar13;
                              fVar14 = local_2ca0._24_4_;
                              auVar202._24_4_ = local_2e20._24_4_ + fVar14;
                              fVar106 = local_2ca0._28_4_;
                              fVar197 = local_2e20._28_4_;
                              auVar202._28_4_ = fVar197 + fVar106;
                              auVar200._0_4_ = auVar198._0_4_ * local_2ea0._0_4_;
                              auVar200._4_4_ = auVar198._4_4_ * local_2ea0._4_4_;
                              auVar200._8_4_ = auVar198._8_4_ * local_2ea0._8_4_;
                              auVar200._12_4_ = auVar198._12_4_ * local_2ea0._12_4_;
                              auVar200._16_4_ = auVar198._16_4_ * local_2ea0._16_4_;
                              auVar200._20_4_ = auVar198._20_4_ * local_2ea0._20_4_;
                              auVar200._28_36_ = in_ZMM14._28_36_;
                              auVar200._24_4_ = auVar198._24_4_ * local_2ea0._24_4_;
                              auVar140 = vfmsub231ps_fma(auVar200._0_32_,local_2e40,auVar202);
                              auVar193 = vsubps_avx(local_2640,auVar126);
                              local_2cc0 = vsubps_avx(auVar193,local_2e80._0_32_);
                              auVar33._4_4_ = auVar202._4_4_ * local_2cc0._4_4_;
                              auVar33._0_4_ = auVar202._0_4_ * local_2cc0._0_4_;
                              auVar33._8_4_ = auVar202._8_4_ * local_2cc0._8_4_;
                              auVar33._12_4_ = auVar202._12_4_ * local_2cc0._12_4_;
                              auVar33._16_4_ = auVar202._16_4_ * local_2cc0._16_4_;
                              auVar33._20_4_ = auVar202._20_4_ * local_2cc0._20_4_;
                              auVar33._24_4_ = auVar202._24_4_ * local_2cc0._24_4_;
                              auVar33._28_4_ = uVar103;
                              auVar203._0_4_ = auVar193._0_4_ + local_2e80._0_4_;
                              auVar203._4_4_ = auVar193._4_4_ + local_2e80._4_4_;
                              auVar203._8_4_ = auVar193._8_4_ + local_2e80._8_4_;
                              auVar203._12_4_ = auVar193._12_4_ + local_2e80._12_4_;
                              auVar203._16_4_ = auVar193._16_4_ + local_2e80._16_4_;
                              auVar203._20_4_ = auVar193._20_4_ + local_2e80._20_4_;
                              auVar203._24_4_ = auVar193._24_4_ + local_2e80._24_4_;
                              auVar203._28_4_ = auVar193._28_4_ + local_2e80._28_4_;
                              auVar107 = vfmsub231ps_fma(auVar33,local_2ea0,auVar203);
                              auVar34._4_4_ = auVar203._4_4_ * local_2e40._4_4_;
                              auVar34._0_4_ = auVar203._0_4_ * local_2e40._0_4_;
                              auVar34._8_4_ = auVar203._8_4_ * local_2e40._8_4_;
                              auVar34._12_4_ = auVar203._12_4_ * local_2e40._12_4_;
                              auVar34._16_4_ = auVar203._16_4_ * local_2e40._16_4_;
                              auVar34._20_4_ = auVar203._20_4_ * local_2e40._20_4_;
                              auVar34._24_4_ = auVar203._24_4_ * local_2e40._24_4_;
                              auVar34._28_4_ = local_2e40._28_4_;
                              auVar108 = vfmsub231ps_fma(auVar34,local_2cc0,auVar198);
                              pRVar1 = ray + 0xc0;
                              fVar105 = *(float *)pRVar1;
                              fVar127 = *(float *)(ray + 0xc4);
                              fVar130 = *(float *)(ray + 200);
                              fVar133 = *(float *)(ray + 0xcc);
                              fVar136 = *(float *)(ray + 0xd0);
                              fVar137 = *(float *)(ray + 0xd4);
                              fVar138 = *(float *)(ray + 0xd8);
                              auVar87 = *(undefined1 (*) [28])pRVar1;
                              auVar35._4_4_ = fVar127 * auVar108._4_4_;
                              auVar35._0_4_ = fVar105 * auVar108._0_4_;
                              auVar35._8_4_ = fVar130 * auVar108._8_4_;
                              auVar35._12_4_ = fVar133 * auVar108._12_4_;
                              auVar35._16_4_ = fVar136 * 0.0;
                              auVar35._20_4_ = fVar137 * 0.0;
                              auVar35._24_4_ = fVar138 * 0.0;
                              auVar35._28_4_ = auVar198._28_4_;
                              local_2ba0 = *(undefined1 (*) [32])(ray + 0xa0);
                              auVar107 = vfmadd231ps_fma(auVar35,local_2ba0,ZEXT1632(auVar107));
                              uVar103 = *(undefined4 *)(puVar95 + -5);
                              local_26a0._4_4_ = uVar103;
                              local_26a0._0_4_ = uVar103;
                              local_26a0._8_4_ = uVar103;
                              local_26a0._12_4_ = uVar103;
                              local_26a0._16_4_ = uVar103;
                              local_26a0._20_4_ = uVar103;
                              local_26a0._24_4_ = uVar103;
                              local_26a0._28_4_ = uVar103;
                              local_2be0 = *(undefined1 (*) [32])(ray + 0x80);
                              auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_2be0,
                                                         ZEXT1632(auVar140));
                              auVar126 = vsubps_avx(local_26a0,auVar126);
                              uVar103 = *(undefined4 *)((long)puVar95 + -0x24);
                              local_26c0._4_4_ = uVar103;
                              local_26c0._0_4_ = uVar103;
                              local_26c0._8_4_ = uVar103;
                              local_26c0._12_4_ = uVar103;
                              local_26c0._16_4_ = uVar103;
                              local_26c0._20_4_ = uVar103;
                              local_26c0._24_4_ = uVar103;
                              local_26c0._28_4_ = uVar103;
                              auVar194 = vsubps_avx(local_26c0,local_2da0);
                              uVar103 = *(undefined4 *)(puVar95 + -4);
                              local_26e0._4_4_ = uVar103;
                              local_26e0._0_4_ = uVar103;
                              local_26e0._8_4_ = uVar103;
                              local_26e0._12_4_ = uVar103;
                              local_26e0._16_4_ = uVar103;
                              local_26e0._20_4_ = uVar103;
                              local_26e0._24_4_ = uVar103;
                              local_26e0._28_4_ = uVar103;
                              auVar144 = vsubps_avx(local_26e0,auVar144);
                              local_2c00 = vsubps_avx(local_2d00,auVar194);
                              auVar120 = vsubps_avx(local_2ca0,auVar144);
                              auVar225._0_4_ = local_2d00._0_4_ + auVar194._0_4_;
                              auVar225._4_4_ = local_2d00._4_4_ + auVar194._4_4_;
                              auVar225._8_4_ = local_2d00._8_4_ + auVar194._8_4_;
                              auVar225._12_4_ = local_2d00._12_4_ + auVar194._12_4_;
                              auVar225._16_4_ = local_2d00._16_4_ + auVar194._16_4_;
                              auVar225._20_4_ = local_2d00._20_4_ + auVar194._20_4_;
                              auVar225._24_4_ = local_2d00._24_4_ + auVar194._24_4_;
                              auVar225._28_4_ = local_2d00._28_4_ + auVar194._28_4_;
                              auVar152._0_4_ = fVar139 + auVar144._0_4_;
                              auVar152._4_4_ = fVar129 + auVar144._4_4_;
                              auVar152._8_4_ = fVar132 + auVar144._8_4_;
                              auVar152._12_4_ = fVar135 + auVar144._12_4_;
                              auVar152._16_4_ = fVar12 + auVar144._16_4_;
                              auVar152._20_4_ = fVar13 + auVar144._20_4_;
                              auVar152._24_4_ = fVar14 + auVar144._24_4_;
                              auVar152._28_4_ = fVar106 + auVar144._28_4_;
                              fVar128 = auVar120._0_4_;
                              fVar131 = auVar120._4_4_;
                              auVar36._4_4_ = auVar225._4_4_ * fVar131;
                              auVar36._0_4_ = auVar225._0_4_ * fVar128;
                              fVar15 = auVar120._8_4_;
                              auVar36._8_4_ = auVar225._8_4_ * fVar15;
                              fVar17 = auVar120._12_4_;
                              auVar36._12_4_ = auVar225._12_4_ * fVar17;
                              fVar160 = auVar120._16_4_;
                              auVar36._16_4_ = auVar225._16_4_ * fVar160;
                              fVar162 = auVar120._20_4_;
                              auVar36._20_4_ = auVar225._20_4_ * fVar162;
                              fVar164 = auVar120._24_4_;
                              auVar36._24_4_ = auVar225._24_4_ * fVar164;
                              auVar36._28_4_ = fVar106;
                              auVar108 = vfmsub231ps_fma(auVar36,local_2c00,auVar152);
                              auVar118 = vsubps_avx(local_2e80._0_32_,auVar126);
                              fVar211 = auVar118._0_4_;
                              fVar213 = auVar118._4_4_;
                              auVar37._4_4_ = fVar213 * auVar152._4_4_;
                              auVar37._0_4_ = fVar211 * auVar152._0_4_;
                              fVar214 = auVar118._8_4_;
                              auVar37._8_4_ = fVar214 * auVar152._8_4_;
                              fVar215 = auVar118._12_4_;
                              auVar37._12_4_ = fVar215 * auVar152._12_4_;
                              fVar216 = auVar118._16_4_;
                              auVar37._16_4_ = fVar216 * auVar152._16_4_;
                              fVar217 = auVar118._20_4_;
                              auVar37._20_4_ = fVar217 * auVar152._20_4_;
                              fVar218 = auVar118._24_4_;
                              auVar37._24_4_ = fVar218 * auVar152._24_4_;
                              auVar37._28_4_ = auVar152._28_4_;
                              auVar187._0_4_ = local_2e80._0_4_ + auVar126._0_4_;
                              auVar187._4_4_ = local_2e80._4_4_ + auVar126._4_4_;
                              auVar187._8_4_ = local_2e80._8_4_ + auVar126._8_4_;
                              auVar187._12_4_ = local_2e80._12_4_ + auVar126._12_4_;
                              auVar187._16_4_ = local_2e80._16_4_ + auVar126._16_4_;
                              auVar187._20_4_ = local_2e80._20_4_ + auVar126._20_4_;
                              auVar187._24_4_ = local_2e80._24_4_ + auVar126._24_4_;
                              auVar187._28_4_ = local_2e80._28_4_ + auVar126._28_4_;
                              auVar140 = vfmsub231ps_fma(auVar37,auVar120,auVar187);
                              fVar106 = local_2c00._0_4_;
                              fVar134 = local_2c00._4_4_;
                              auVar38._4_4_ = auVar187._4_4_ * fVar134;
                              auVar38._0_4_ = auVar187._0_4_ * fVar106;
                              fVar16 = local_2c00._8_4_;
                              auVar38._8_4_ = auVar187._8_4_ * fVar16;
                              fVar18 = local_2c00._12_4_;
                              auVar38._12_4_ = auVar187._12_4_ * fVar18;
                              fVar161 = local_2c00._16_4_;
                              auVar38._16_4_ = auVar187._16_4_ * fVar161;
                              fVar163 = local_2c00._20_4_;
                              auVar38._20_4_ = auVar187._20_4_ * fVar163;
                              fVar165 = local_2c00._24_4_;
                              auVar38._24_4_ = auVar187._24_4_ * fVar165;
                              auVar38._28_4_ = auVar187._28_4_;
                              auVar109 = vfmsub231ps_fma(auVar38,auVar118,auVar225);
                              auVar39._4_4_ = fVar127 * auVar109._4_4_;
                              auVar39._0_4_ = fVar105 * auVar109._0_4_;
                              auVar39._8_4_ = fVar130 * auVar109._8_4_;
                              auVar39._12_4_ = fVar133 * auVar109._12_4_;
                              auVar39._16_4_ = fVar136 * 0.0;
                              auVar39._20_4_ = fVar137 * 0.0;
                              auVar39._24_4_ = fVar138 * 0.0;
                              auVar39._28_4_ = local_2c00._28_4_;
                              auVar140 = vfmadd231ps_fma(auVar39,local_2ba0,ZEXT1632(auVar140));
                              auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),local_2be0,
                                                         ZEXT1632(auVar108));
                              local_2f60 = ZEXT1632(auVar140);
                              auVar125 = vsubps_avx(auVar126,auVar193);
                              auVar153._0_4_ = auVar193._0_4_ + auVar126._0_4_;
                              auVar153._4_4_ = auVar193._4_4_ + auVar126._4_4_;
                              auVar153._8_4_ = auVar193._8_4_ + auVar126._8_4_;
                              auVar153._12_4_ = auVar193._12_4_ + auVar126._12_4_;
                              auVar153._16_4_ = auVar193._16_4_ + auVar126._16_4_;
                              auVar153._20_4_ = auVar193._20_4_ + auVar126._20_4_;
                              auVar153._24_4_ = auVar193._24_4_ + auVar126._24_4_;
                              auVar153._28_4_ = auVar193._28_4_ + auVar126._28_4_;
                              auVar183 = vsubps_avx(auVar194,auVar119);
                              auVar170._0_4_ = auVar119._0_4_ + auVar194._0_4_;
                              auVar170._4_4_ = auVar119._4_4_ + auVar194._4_4_;
                              auVar170._8_4_ = auVar119._8_4_ + auVar194._8_4_;
                              auVar170._12_4_ = auVar119._12_4_ + auVar194._12_4_;
                              auVar170._16_4_ = auVar119._16_4_ + auVar194._16_4_;
                              auVar170._20_4_ = auVar119._20_4_ + auVar194._20_4_;
                              auVar170._24_4_ = auVar119._24_4_ + auVar194._24_4_;
                              auVar170._28_4_ = auVar119._28_4_ + auVar194._28_4_;
                              auVar19 = vsubps_avx(auVar144,local_2e20);
                              auVar117._0_4_ = auVar144._0_4_ + local_2e20._0_4_;
                              auVar117._4_4_ = auVar144._4_4_ + local_2e20._4_4_;
                              auVar117._8_4_ = auVar144._8_4_ + local_2e20._8_4_;
                              auVar117._12_4_ = auVar144._12_4_ + local_2e20._12_4_;
                              auVar117._16_4_ = auVar144._16_4_ + local_2e20._16_4_;
                              auVar117._20_4_ = auVar144._20_4_ + local_2e20._20_4_;
                              auVar117._24_4_ = auVar144._24_4_ + local_2e20._24_4_;
                              auVar117._28_4_ = auVar144._28_4_ + fVar197;
                              auVar40._4_4_ = auVar19._4_4_ * auVar170._4_4_;
                              auVar40._0_4_ = auVar19._0_4_ * auVar170._0_4_;
                              auVar40._8_4_ = auVar19._8_4_ * auVar170._8_4_;
                              auVar40._12_4_ = auVar19._12_4_ * auVar170._12_4_;
                              auVar40._16_4_ = auVar19._16_4_ * auVar170._16_4_;
                              auVar40._20_4_ = auVar19._20_4_ * auVar170._20_4_;
                              auVar40._24_4_ = auVar19._24_4_ * auVar170._24_4_;
                              auVar40._28_4_ = fVar197;
                              auVar109 = vfmsub231ps_fma(auVar40,auVar183,auVar117);
                              auVar41._4_4_ = auVar125._4_4_ * auVar117._4_4_;
                              auVar41._0_4_ = auVar125._0_4_ * auVar117._0_4_;
                              auVar41._8_4_ = auVar125._8_4_ * auVar117._8_4_;
                              auVar41._12_4_ = auVar125._12_4_ * auVar117._12_4_;
                              auVar41._16_4_ = auVar125._16_4_ * auVar117._16_4_;
                              auVar41._20_4_ = auVar125._20_4_ * auVar117._20_4_;
                              auVar41._24_4_ = auVar125._24_4_ * auVar117._24_4_;
                              auVar41._28_4_ = auVar117._28_4_;
                              auVar108 = vfmsub231ps_fma(auVar41,auVar19,auVar153);
                              auVar42._4_4_ = auVar183._4_4_ * auVar153._4_4_;
                              auVar42._0_4_ = auVar183._0_4_ * auVar153._0_4_;
                              auVar42._8_4_ = auVar183._8_4_ * auVar153._8_4_;
                              auVar42._12_4_ = auVar183._12_4_ * auVar153._12_4_;
                              auVar42._16_4_ = auVar183._16_4_ * auVar153._16_4_;
                              auVar42._20_4_ = auVar183._20_4_ * auVar153._20_4_;
                              auVar42._24_4_ = auVar183._24_4_ * auVar153._24_4_;
                              auVar42._28_4_ = auVar153._28_4_;
                              auVar110 = vfmsub231ps_fma(auVar42,auVar125,auVar170);
                              _local_2bc0 = *(undefined1 (*) [32])pRVar1;
                              auVar20 = _local_2bc0;
                              auVar154._0_4_ = fVar105 * auVar110._0_4_;
                              auVar154._4_4_ = fVar127 * auVar110._4_4_;
                              auVar154._8_4_ = fVar130 * auVar110._8_4_;
                              auVar154._12_4_ = fVar133 * auVar110._12_4_;
                              auVar154._16_4_ = fVar136 * 0.0;
                              auVar154._20_4_ = fVar137 * 0.0;
                              auVar154._24_4_ = fVar138 * 0.0;
                              auVar154._28_4_ = 0;
                              auVar108 = vfmadd231ps_fma(auVar154,local_2ba0,ZEXT1632(auVar108));
                              auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),local_2be0,
                                                         ZEXT1632(auVar109));
                              local_2da0 = ZEXT1632(CONCAT412(auVar108._12_4_ +
                                                              auVar107._12_4_ + auVar140._12_4_,
                                                              CONCAT48(auVar108._8_4_ +
                                                                       auVar107._8_4_ +
                                                                       auVar140._8_4_,
                                                                       CONCAT44(auVar108._4_4_ +
                                                                                auVar107._4_4_ +
                                                                                auVar140._4_4_,
                                                                                auVar108._0_4_ +
                                                                                auVar107._0_4_ +
                                                                                auVar140._0_4_))));
                              auVar126 = vandps_avx(local_2da0,local_2b60);
                              fVar105 = auVar126._0_4_ * 1.1920929e-07;
                              fVar127 = auVar126._4_4_ * 1.1920929e-07;
                              auVar43._4_4_ = fVar127;
                              auVar43._0_4_ = fVar105;
                              fVar130 = auVar126._8_4_ * 1.1920929e-07;
                              auVar43._8_4_ = fVar130;
                              fVar133 = auVar126._12_4_ * 1.1920929e-07;
                              auVar43._12_4_ = fVar133;
                              fVar136 = auVar126._16_4_ * 1.1920929e-07;
                              auVar43._16_4_ = fVar136;
                              fVar137 = auVar126._20_4_ * 1.1920929e-07;
                              auVar43._20_4_ = fVar137;
                              fVar138 = auVar126._24_4_ * 1.1920929e-07;
                              auVar43._24_4_ = fVar138;
                              auVar43._28_4_ = auVar126._28_4_;
                              local_2e20 = ZEXT1632(auVar107);
                              auVar144 = vminps_avx(local_2e20,ZEXT1632(auVar140));
                              auVar144 = vminps_avx(auVar144,ZEXT1632(auVar108));
                              auVar208._8_4_ = 0x80000000;
                              auVar208._0_8_ = 0x8000000080000000;
                              auVar208._12_4_ = 0x80000000;
                              auVar208._16_4_ = 0x80000000;
                              auVar208._20_4_ = 0x80000000;
                              auVar208._24_4_ = 0x80000000;
                              auVar208._28_4_ = 0x80000000;
                              auVar181._0_8_ = CONCAT44(fVar127,fVar105) ^ 0x8000000080000000;
                              auVar181._8_4_ = -fVar130;
                              auVar181._12_4_ = -fVar133;
                              auVar181._16_4_ = -fVar136;
                              auVar181._20_4_ = -fVar137;
                              auVar181._24_4_ = -fVar138;
                              auVar181._28_4_ = auVar126._28_4_ ^ 0x80000000;
                              auVar119 = vcmpps_avx(auVar144,auVar181,5);
                              auVar179 = ZEXT3264(auVar119);
                              auVar193 = vmaxps_avx(local_2e20,ZEXT1632(auVar140));
                              auVar194 = vmaxps_avx(auVar193,ZEXT1632(auVar108));
                              auVar126 = vcmpps_avx(auVar194,auVar43,2);
                              auVar126 = vorps_avx(auVar119,auVar126);
                              auVar21 = auVar184 & auVar126;
                              auVar126 = vandps_avx(auVar126,auVar184);
                              auVar200 = ZEXT3264(auVar126);
                              local_2700 = *(undefined4 *)(puVar95 + -3);
                              uStack_26fc = local_2700;
                              uStack_26f8 = local_2700;
                              uStack_26f4 = local_2700;
                              uStack_26f0 = local_2700;
                              uStack_26ec = local_2700;
                              uStack_26e8 = local_2700;
                              uStack_26e4 = local_2700;
                              local_2720 = *(undefined4 *)((long)puVar95 + -0x14);
                              uStack_271c = local_2720;
                              uStack_2718 = local_2720;
                              uStack_2714 = local_2720;
                              uStack_2710 = local_2720;
                              uStack_270c = local_2720;
                              uStack_2708 = local_2720;
                              uStack_2704 = local_2720;
                              local_2740 = *(undefined4 *)(puVar95 + -2);
                              uStack_273c = local_2740;
                              uStack_2738 = local_2740;
                              uStack_2734 = local_2740;
                              uStack_2730 = local_2740;
                              uStack_272c = local_2740;
                              uStack_2728 = local_2740;
                              uStack_2724 = local_2740;
                              auVar144 = _local_2d20;
                              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar21 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar21 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar21 >> 0x7f,0) == '\0')
                                    && (auVar21 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar21 >> 0xbf,0) == '\0')
                                  && (auVar21 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar21[0x1f]) {
                                local_2f60 = _local_2d40;
                                local_2da0 = local_2ce0;
                                in_ZMM14 = ZEXT3264(local_2dc0);
                                auVar212 = ZEXT3264(CONCAT428(0x7f800000,
                                                              CONCAT424(0x7f800000,
                                                                        CONCAT420(0x7f800000,
                                                                                  CONCAT416(
                                                  0x7f800000,
                                                  CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                  )))));
                              }
                              else {
                                auVar44._4_4_ = fVar134 * local_2ea0._4_4_;
                                auVar44._0_4_ = fVar106 * local_2ea0._0_4_;
                                auVar44._8_4_ = fVar16 * local_2ea0._8_4_;
                                auVar44._12_4_ = fVar18 * local_2ea0._12_4_;
                                auVar44._16_4_ = fVar161 * local_2ea0._16_4_;
                                auVar44._20_4_ = fVar163 * local_2ea0._20_4_;
                                auVar44._24_4_ = fVar165 * local_2ea0._24_4_;
                                auVar44._28_4_ = local_2740;
                                auVar45._4_4_ = fVar213 * local_2e40._4_4_;
                                auVar45._0_4_ = fVar211 * local_2e40._0_4_;
                                auVar45._8_4_ = fVar214 * local_2e40._8_4_;
                                auVar45._12_4_ = fVar215 * local_2e40._12_4_;
                                auVar45._16_4_ = fVar216 * local_2e40._16_4_;
                                auVar45._20_4_ = fVar217 * local_2e40._20_4_;
                                auVar45._24_4_ = fVar218 * local_2e40._24_4_;
                                auVar45._28_4_ = auVar194._28_4_;
                                auVar107 = vfmsub213ps_fma(local_2e40,auVar120,auVar44);
                                auVar46._4_4_ = auVar183._4_4_ * fVar131;
                                auVar46._0_4_ = auVar183._0_4_ * fVar128;
                                auVar46._8_4_ = auVar183._8_4_ * fVar15;
                                auVar46._12_4_ = auVar183._12_4_ * fVar17;
                                auVar46._16_4_ = auVar183._16_4_ * fVar160;
                                auVar46._20_4_ = auVar183._20_4_ * fVar162;
                                auVar46._24_4_ = auVar183._24_4_ * fVar164;
                                auVar46._28_4_ = auVar119._28_4_;
                                auVar47._4_4_ = fVar213 * auVar19._4_4_;
                                auVar47._0_4_ = fVar211 * auVar19._0_4_;
                                auVar47._8_4_ = fVar214 * auVar19._8_4_;
                                auVar47._12_4_ = fVar215 * auVar19._12_4_;
                                auVar47._16_4_ = fVar216 * auVar19._16_4_;
                                auVar47._20_4_ = fVar217 * auVar19._20_4_;
                                auVar47._24_4_ = fVar218 * auVar19._24_4_;
                                auVar47._28_4_ = auVar193._28_4_;
                                auVar140 = vfmsub213ps_fma(auVar19,local_2c00,auVar46);
                                auVar119 = vandps_avx(auVar44,local_2b60);
                                auVar193 = vandps_avx(auVar46,local_2b60);
                                auVar119 = vcmpps_avx(auVar119,auVar193,1);
                                auVar194 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar107),
                                                         auVar119);
                                auVar48._4_4_ = auVar125._4_4_ * fVar134;
                                auVar48._0_4_ = auVar125._0_4_ * fVar106;
                                auVar48._8_4_ = auVar125._8_4_ * fVar16;
                                auVar48._12_4_ = auVar125._12_4_ * fVar18;
                                auVar48._16_4_ = auVar125._16_4_ * fVar161;
                                auVar48._20_4_ = auVar125._20_4_ * fVar163;
                                auVar48._24_4_ = auVar125._24_4_ * fVar165;
                                auVar48._28_4_ = auVar119._28_4_;
                                auVar107 = vfmsub213ps_fma(auVar125,auVar120,auVar47);
                                auVar49._4_4_ = fVar131 * local_2cc0._4_4_;
                                auVar49._0_4_ = fVar128 * local_2cc0._0_4_;
                                auVar49._8_4_ = fVar15 * local_2cc0._8_4_;
                                auVar49._12_4_ = fVar17 * local_2cc0._12_4_;
                                auVar49._16_4_ = fVar160 * local_2cc0._16_4_;
                                auVar49._20_4_ = fVar162 * local_2cc0._20_4_;
                                auVar49._24_4_ = fVar164 * local_2cc0._24_4_;
                                auVar49._28_4_ = auVar193._28_4_;
                                auVar140 = vfmsub213ps_fma(local_2ea0,auVar118,auVar49);
                                auVar119 = vandps_avx(auVar49,local_2b60);
                                auVar193 = vandps_avx(auVar47,local_2b60);
                                auVar119 = vcmpps_avx(auVar119,auVar193,1);
                                auVar120 = vblendvps_avx(ZEXT1632(auVar107),ZEXT1632(auVar140),
                                                         auVar119);
                                in_ZMM14 = ZEXT3264(auVar120);
                                auVar107 = vfmsub213ps_fma(local_2cc0,local_2c00,auVar45);
                                auVar140 = vfmsub213ps_fma(auVar183,auVar118,auVar48);
                                auVar119 = vandps_avx(auVar45,local_2b60);
                                auVar193 = vandps_avx(auVar48,local_2b60);
                                auVar119 = vcmpps_avx(auVar119,auVar193,1);
                                auVar193 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar107),
                                                         auVar119);
                                local_2bc0._0_4_ = auVar87._0_4_;
                                local_2bc0._4_4_ = auVar87._4_4_;
                                fStack_2bb8 = auVar87._8_4_;
                                fStack_2bb4 = auVar87._12_4_;
                                fStack_2bb0 = auVar87._16_4_;
                                fStack_2bac = auVar87._20_4_;
                                fStack_2ba8 = auVar87._24_4_;
                                auVar50._4_4_ = auVar193._4_4_ * (float)local_2bc0._4_4_;
                                auVar50._0_4_ = auVar193._0_4_ * (float)local_2bc0._0_4_;
                                auVar50._8_4_ = auVar193._8_4_ * fStack_2bb8;
                                auVar50._12_4_ = auVar193._12_4_ * fStack_2bb4;
                                auVar50._16_4_ = auVar193._16_4_ * fStack_2bb0;
                                auVar50._20_4_ = auVar193._20_4_ * fStack_2bac;
                                auVar50._24_4_ = auVar193._24_4_ * fStack_2ba8;
                                auVar50._28_4_ = auVar119._28_4_;
                                auVar107 = vfmadd213ps_fma(local_2ba0,auVar120,auVar50);
                                auVar107 = vfmadd213ps_fma(local_2be0,auVar194,ZEXT1632(auVar107));
                                fVar106 = auVar107._0_4_ + auVar107._0_4_;
                                fVar128 = auVar107._4_4_ + auVar107._4_4_;
                                fVar131 = auVar107._8_4_ + auVar107._8_4_;
                                fVar134 = auVar107._12_4_ + auVar107._12_4_;
                                auVar118 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar131,CONCAT44(
                                                  fVar128,fVar106))));
                                auVar155._0_4_ = auVar193._0_4_ * fVar139;
                                auVar155._4_4_ = auVar193._4_4_ * fVar129;
                                auVar155._8_4_ = auVar193._8_4_ * fVar132;
                                auVar155._12_4_ = auVar193._12_4_ * fVar135;
                                auVar155._16_4_ = auVar193._16_4_ * fVar12;
                                auVar155._20_4_ = auVar193._20_4_ * fVar13;
                                auVar155._24_4_ = auVar193._24_4_ * fVar14;
                                auVar155._28_4_ = 0;
                                auVar107 = vfmadd213ps_fma(local_2d00,auVar120,auVar155);
                                auVar140 = vfmadd213ps_fma(local_2e80._0_32_,auVar194,
                                                           ZEXT1632(auVar107));
                                auVar119 = vrcpps_avx(auVar118);
                                auVar196._8_4_ = 0x3f800000;
                                auVar196._0_8_ = 0x3f8000003f800000;
                                auVar196._12_4_ = 0x3f800000;
                                auVar196._16_4_ = 0x3f800000;
                                auVar196._20_4_ = 0x3f800000;
                                auVar196._24_4_ = 0x3f800000;
                                auVar196._28_4_ = 0x3f800000;
                                auVar107 = vfnmadd213ps_fma(auVar119,auVar118,auVar196);
                                auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar119,auVar119);
                                auVar125 = ZEXT1632(CONCAT412((auVar140._12_4_ + auVar140._12_4_) *
                                                              auVar107._12_4_,
                                                              CONCAT48((auVar140._8_4_ +
                                                                       auVar140._8_4_) *
                                                                       auVar107._8_4_,
                                                                       CONCAT44((auVar140._4_4_ +
                                                                                auVar140._4_4_) *
                                                                                auVar107._4_4_,
                                                                                (auVar140._0_4_ +
                                                                                auVar140._0_4_) *
                                                                                auVar107._0_4_))));
                                auVar119 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar125,2)
                                ;
                                auVar120 = vcmpps_avx(auVar125,*(undefined1 (*) [32])(ray + 0x100),2
                                                     );
                                auVar119 = vandps_avx(auVar119,auVar120);
                                auVar171._0_8_ = CONCAT44(fVar128,fVar106) ^ 0x8000000080000000;
                                auVar171._8_4_ = -fVar131;
                                auVar171._12_4_ = -fVar134;
                                auVar171._16_4_ = 0x80000000;
                                auVar171._20_4_ = 0x80000000;
                                auVar171._24_4_ = 0x80000000;
                                auVar171._28_4_ = 0x80000000;
                                auVar179 = ZEXT3264(auVar171);
                                auVar120 = vcmpps_avx(auVar118,auVar171,4);
                                auVar119 = vandps_avx(auVar120,auVar119);
                                auVar119 = vpslld_avx2(auVar119,0x1f);
                                auVar120 = vpsrad_avx2(auVar119,0x1f);
                                auVar119 = auVar126 & auVar120;
                                auVar126 = vandps_avx(auVar120,auVar126);
                                auVar200 = ZEXT3264(auVar126);
                                if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0 &&
                                         (auVar119 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar119 >> 0x5f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar119 >> 0x7f,0) == '\0'
                                       ) && (auVar119 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                     SUB321(auVar119 >> 0xbf,0) == '\0') &&
                                    (auVar119 & (undefined1  [32])0x100000000) ==
                                    (undefined1  [32])0x0) && -1 < auVar119[0x1f]) {
                                  local_2f60 = _local_2d40;
                                  local_2da0 = local_2ce0;
                                  in_ZMM14 = ZEXT3264(local_2dc0);
                                  auVar212 = ZEXT3264(CONCAT428(0x7f800000,
                                                                CONCAT424(0x7f800000,
                                                                          CONCAT420(0x7f800000,
                                                                                    CONCAT416(
                                                  0x7f800000,
                                                  CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                  )))));
                                }
                                else {
                                  auVar212 = ZEXT3264(CONCAT428(0x7f800000,
                                                                CONCAT424(0x7f800000,
                                                                          CONCAT420(0x7f800000,
                                                                                    CONCAT416(
                                                  0x7f800000,
                                                  CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                  )))));
                                  local_2f00 = auVar194;
                                  local_2e00 = auVar125;
                                  local_2de0 = auVar193;
                                  auVar144 = local_2e20;
                                }
                              }
                              auVar205 = ZEXT3264(auVar208);
                              auVar119 = auVar200._0_32_;
                              uVar98 = unaff_R14;
                              auVar126 = auVar184;
                              local_2f40._0_32_ = auVar184;
                              _local_2bc0 = auVar20;
                              if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar119 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar119 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar119 >> 0x7f,0) != '\0')
                                    || (auVar200 & (undefined1  [64])0x100000000) !=
                                       (undefined1  [64])0x0) || SUB321(auVar119 >> 0xbf,0) != '\0')
                                  || (auVar200 & (undefined1  [64])0x100000000) !=
                                     (undefined1  [64])0x0) || auVar200[0x1f] < '\0') {
                                auVar114._0_4_ = (float)(int)(*(ushort *)(lVar22 + 8 + lVar99) - 1);
                                auVar114._4_8_ = SUB128(ZEXT812(0),4);
                                auVar114._12_4_ = 0;
                                auVar107 = vrcpss_avx(auVar114,auVar114);
                                local_2ca0 = auVar119;
                                auVar140 = vfnmadd213ss_fma(auVar114,auVar107,
                                                            SUB6416(ZEXT464(0x40000000),0));
                                auVar108 = ZEXT416((uint)(float)(int)(*(ushort *)
                                                                       (lVar22 + 10 + lVar99) - 1));
                                fVar139 = auVar107._0_4_ * auVar140._0_4_;
                                fVar129 = (float)(int)(((uint)unaff_R14 & 1) + uVar90);
                                auVar200 = ZEXT3264(local_2da0);
                                auVar51._4_4_ =
                                     (auVar144._4_4_ + fVar129 * local_2da0._4_4_) * fVar139;
                                auVar51._0_4_ =
                                     (auVar144._0_4_ + fVar129 * local_2da0._0_4_) * fVar139;
                                auVar51._8_4_ =
                                     (auVar144._8_4_ + fVar129 * local_2da0._8_4_) * fVar139;
                                auVar51._12_4_ =
                                     (auVar144._12_4_ + fVar129 * local_2da0._12_4_) * fVar139;
                                auVar51._16_4_ =
                                     (auVar144._16_4_ + fVar129 * local_2da0._16_4_) * fVar139;
                                auVar51._20_4_ =
                                     (auVar144._20_4_ + fVar129 * local_2da0._20_4_) * fVar139;
                                auVar51._24_4_ =
                                     (auVar144._24_4_ + fVar129 * local_2da0._24_4_) * fVar139;
                                auVar51._28_4_ = fVar139;
                                auVar107 = vrcpss_avx(auVar108,auVar108);
                                auVar144 = vblendvps_avx(auVar144,auVar51,auVar119);
                                auVar140 = vfnmadd213ss_fma(auVar108,auVar107,
                                                            SUB6416(ZEXT464(0x40000000),0));
                                fVar129 = (float)(int)(((uint)(unaff_R14 >> 1) & 0x7fffffff) +
                                                      uVar92);
                                fVar139 = auVar107._0_4_ * auVar140._0_4_;
                                auVar179 = ZEXT3264(auVar119);
                                auVar52._4_4_ =
                                     (local_2f60._4_4_ + fVar129 * local_2da0._4_4_) * fVar139;
                                auVar52._0_4_ =
                                     (local_2f60._0_4_ + fVar129 * local_2da0._0_4_) * fVar139;
                                auVar52._8_4_ =
                                     (local_2f60._8_4_ + fVar129 * local_2da0._8_4_) * fVar139;
                                auVar52._12_4_ =
                                     (local_2f60._12_4_ + fVar129 * local_2da0._12_4_) * fVar139;
                                auVar52._16_4_ =
                                     (local_2f60._16_4_ + fVar129 * local_2da0._16_4_) * fVar139;
                                auVar52._20_4_ =
                                     (local_2f60._20_4_ + fVar129 * local_2da0._20_4_) * fVar139;
                                auVar52._24_4_ =
                                     (local_2f60._24_4_ + fVar129 * local_2da0._24_4_) * fVar139;
                                auVar52._28_4_ = local_2f60._28_4_ + fVar129;
                                local_2f60 = vblendvps_avx(local_2f60,auVar52,auVar119);
                                local_2e80._0_8_ = unaff_R14;
                                uVar7 = *(uint *)(local_2d50 + unaff_R14 * 4);
                                pGVar8 = (context->scene->geometries).items[uVar7].ptr;
                                uVar89 = pGVar8->mask;
                                auVar121._4_4_ = uVar89;
                                auVar121._0_4_ = uVar89;
                                auVar121._8_4_ = uVar89;
                                auVar121._12_4_ = uVar89;
                                auVar121._16_4_ = uVar89;
                                auVar121._20_4_ = uVar89;
                                auVar121._24_4_ = uVar89;
                                auVar121._28_4_ = uVar89;
                                auVar126 = vpand_avx2(auVar121,*(undefined1 (*) [32])(ray + 0x120));
                                auVar193 = vpcmpeqd_avx2(auVar126,_DAT_01faff00);
                                auVar126 = auVar119 & ~auVar193;
                                if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar126 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar126 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar126 >> 0x7f,0) != '\0'
                                       ) || (auVar126 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                     SUB321(auVar126 >> 0xbf,0) != '\0') ||
                                    (auVar126 & (undefined1  [32])0x100000000) !=
                                    (undefined1  [32])0x0) || auVar126[0x1f] < '\0') {
                                  uVar103 = *(undefined4 *)(local_2d60 + unaff_R14 * 4);
                                  auVar126 = vandnps_avx(auVar193,auVar119);
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar200 = ZEXT3264(local_2da0);
                                    auVar184 = vandps_avx(local_2da0,local_2b60);
                                    auVar119 = vrcpps_avx(local_2da0);
                                    auVar191._8_4_ = 0x3f800000;
                                    auVar191._0_8_ = 0x3f8000003f800000;
                                    auVar191._12_4_ = 0x3f800000;
                                    auVar191._16_4_ = 0x3f800000;
                                    auVar191._20_4_ = 0x3f800000;
                                    auVar191._24_4_ = 0x3f800000;
                                    auVar191._28_4_ = 0x3f800000;
                                    auVar107 = vfnmadd213ps_fma(auVar119,local_2da0,auVar191);
                                    auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar119,auVar119)
                                    ;
                                    auVar174._8_4_ = 0x219392ef;
                                    auVar174._0_8_ = 0x219392ef219392ef;
                                    auVar174._12_4_ = 0x219392ef;
                                    auVar174._16_4_ = 0x219392ef;
                                    auVar174._20_4_ = 0x219392ef;
                                    auVar174._24_4_ = 0x219392ef;
                                    auVar174._28_4_ = 0x219392ef;
                                    auVar184 = vcmpps_avx(auVar184,auVar174,5);
                                    auVar184 = vandps_avx(auVar184,ZEXT1632(auVar107));
                                    auVar73._4_4_ = auVar144._4_4_ * auVar184._4_4_;
                                    auVar73._0_4_ = auVar144._0_4_ * auVar184._0_4_;
                                    auVar73._8_4_ = auVar144._8_4_ * auVar184._8_4_;
                                    auVar73._12_4_ = auVar144._12_4_ * auVar184._12_4_;
                                    auVar73._16_4_ = auVar144._16_4_ * auVar184._16_4_;
                                    auVar73._20_4_ = auVar144._20_4_ * auVar184._20_4_;
                                    auVar73._24_4_ = auVar144._24_4_ * auVar184._24_4_;
                                    auVar73._28_4_ = 0x219392ef;
                                    auVar193 = vminps_avx(auVar73,auVar191);
                                    auVar74._4_4_ = local_2f60._4_4_ * auVar184._4_4_;
                                    auVar74._0_4_ = local_2f60._0_4_ * auVar184._0_4_;
                                    auVar74._8_4_ = local_2f60._8_4_ * auVar184._8_4_;
                                    auVar74._12_4_ = local_2f60._12_4_ * auVar184._12_4_;
                                    auVar74._16_4_ = local_2f60._16_4_ * auVar184._16_4_;
                                    auVar74._20_4_ = local_2f60._20_4_ * auVar184._20_4_;
                                    auVar74._24_4_ = local_2f60._24_4_ * auVar184._24_4_;
                                    auVar74._28_4_ = auVar184._28_4_;
                                    local_2900 = vminps_avx(auVar74,auVar191);
                                    pRVar11 = context->user;
                                    local_2980[0] = (RTCHitN)local_2f00[0];
                                    local_2980[1] = (RTCHitN)local_2f00[1];
                                    local_2980[2] = (RTCHitN)local_2f00[2];
                                    local_2980[3] = (RTCHitN)local_2f00[3];
                                    local_2980[4] = (RTCHitN)local_2f00[4];
                                    local_2980[5] = (RTCHitN)local_2f00[5];
                                    local_2980[6] = (RTCHitN)local_2f00[6];
                                    local_2980[7] = (RTCHitN)local_2f00[7];
                                    local_2980[8] = (RTCHitN)local_2f00[8];
                                    local_2980[9] = (RTCHitN)local_2f00[9];
                                    local_2980[10] = (RTCHitN)local_2f00[10];
                                    local_2980[0xb] = (RTCHitN)local_2f00[0xb];
                                    local_2980[0xc] = (RTCHitN)local_2f00[0xc];
                                    local_2980[0xd] = (RTCHitN)local_2f00[0xd];
                                    local_2980[0xe] = (RTCHitN)local_2f00[0xe];
                                    local_2980[0xf] = (RTCHitN)local_2f00[0xf];
                                    local_2980[0x10] = (RTCHitN)local_2f00[0x10];
                                    local_2980[0x11] = (RTCHitN)local_2f00[0x11];
                                    local_2980[0x12] = (RTCHitN)local_2f00[0x12];
                                    local_2980[0x13] = (RTCHitN)local_2f00[0x13];
                                    local_2980[0x14] = (RTCHitN)local_2f00[0x14];
                                    local_2980[0x15] = (RTCHitN)local_2f00[0x15];
                                    local_2980[0x16] = (RTCHitN)local_2f00[0x16];
                                    local_2980[0x17] = (RTCHitN)local_2f00[0x17];
                                    local_2980[0x18] = (RTCHitN)local_2f00[0x18];
                                    local_2980[0x19] = (RTCHitN)local_2f00[0x19];
                                    local_2980[0x1a] = (RTCHitN)local_2f00[0x1a];
                                    local_2980[0x1b] = (RTCHitN)local_2f00[0x1b];
                                    local_2980[0x1c] = (RTCHitN)local_2f00[0x1c];
                                    local_2980[0x1d] = (RTCHitN)local_2f00[0x1d];
                                    local_2980[0x1e] = (RTCHitN)local_2f00[0x1e];
                                    local_2980[0x1f] = (RTCHitN)local_2f00[0x1f];
                                    local_2dc0 = in_ZMM14._0_32_;
                                    local_2960 = local_2dc0;
                                    local_2940 = local_2de0;
                                    local_2920 = auVar193;
                                    local_28e0 = uVar103;
                                    uStack_28dc = uVar103;
                                    uStack_28d8 = uVar103;
                                    uStack_28d4 = uVar103;
                                    uStack_28d0 = uVar103;
                                    uStack_28cc = uVar103;
                                    uStack_28c8 = uVar103;
                                    uStack_28c4 = uVar103;
                                    local_28c0 = uVar7;
                                    uStack_28bc = uVar7;
                                    uStack_28b8 = uVar7;
                                    uStack_28b4 = uVar7;
                                    uStack_28b0 = uVar7;
                                    uStack_28ac = uVar7;
                                    uStack_28a8 = uVar7;
                                    uStack_28a4 = uVar7;
                                    auVar184 = vpcmpeqd_avx2(local_2900,local_2900);
                                    local_2e50[1] = auVar184;
                                    *local_2e50 = auVar184;
                                    local_28a0 = pRVar11->instID[0];
                                    uStack_289c = local_28a0;
                                    uStack_2898 = local_28a0;
                                    uStack_2894 = local_28a0;
                                    uStack_2890 = local_28a0;
                                    uStack_288c = local_28a0;
                                    uStack_2888 = local_28a0;
                                    uStack_2884 = local_28a0;
                                    local_2880 = pRVar11->instPrimID[0];
                                    uStack_287c = local_2880;
                                    uStack_2878 = local_2880;
                                    uStack_2874 = local_2880;
                                    uStack_2870 = local_2880;
                                    uStack_286c = local_2880;
                                    uStack_2868 = local_2880;
                                    uStack_2864 = local_2880;
                                    auVar184 = *(undefined1 (*) [32])(ray + 0x100);
                                    auVar119 = vblendvps_avx(auVar184,local_2e00,auVar126);
                                    *(undefined1 (*) [32])(ray + 0x100) = auVar119;
                                    local_2d80 = auVar126;
                                    local_2ed0.geometryUserPtr = pGVar8->userPtr;
                                    local_2ed0.valid = (int *)local_2d80;
                                    local_2ed0.context = context->user;
                                    local_2ed0.ray = (RTCRayN *)ray;
                                    local_2ed0.hit = local_2980;
                                    local_2ed0.N = 8;
                                    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                      local_2e40._0_4_ = uVar90;
                                      local_2ea0._0_4_ = uVar92;
                                      auVar193 = ZEXT1632(auVar193._0_16_);
                                      auVar200 = ZEXT1664(local_2da0._0_16_);
                                      local_2e20 = auVar144;
                                      local_2d00 = auVar208;
                                      local_2cc0 = auVar184;
                                      (*pGVar8->occlusionFilterN)(&local_2ed0);
                                      in_ZMM14 = ZEXT3264(local_2dc0);
                                      auVar205 = ZEXT3264(local_2d00);
                                      auVar212 = ZEXT3264(CONCAT428(0x7f800000,
                                                                    CONCAT424(0x7f800000,
                                                                              CONCAT420(0x7f800000,
                                                                                        CONCAT416(
                                                  0x7f800000,
                                                  CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                  )))));
                                      context = local_2f68;
                                      uVar92 = local_2ea0._0_4_;
                                      auVar184 = local_2cc0;
                                      uVar90 = local_2e40._0_4_;
                                      auVar144 = local_2e20;
                                    }
                                    auVar126 = vpcmpeqd_avx2(local_2d80,_DAT_01faff00);
                                    auVar193 = vpcmpeqd_avx2(auVar193,auVar193);
                                    auVar119 = auVar193 & ~auVar126;
                                    if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0 &&
                                             (auVar119 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar119 >> 0x5f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar119 >> 0x7f,0) == '\0') &&
                                          (auVar119 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar119 >> 0xbf,0) == '\0') &&
                                        (auVar119 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && -1 < auVar119[0x1f]) {
                                      auVar126 = auVar126 ^ auVar193;
                                    }
                                    else {
                                      p_Var10 = context->args->filter;
                                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                        local_2ea0._0_4_ = uVar92;
                                        local_2d00 = auVar205._0_32_;
                                        local_2dc0 = in_ZMM14._0_32_;
                                        auVar200 = ZEXT1664(auVar200._0_16_);
                                        local_2e20 = auVar144;
                                        local_2cc0 = auVar184;
                                        (*p_Var10)(&local_2ed0);
                                        in_ZMM14 = ZEXT3264(local_2dc0);
                                        auVar205 = ZEXT3264(local_2d00);
                                        auVar212 = ZEXT3264(CONCAT428(0x7f800000,
                                                                      CONCAT424(0x7f800000,
                                                                                CONCAT420(0x7f800000
                                                                                          ,CONCAT416
                                                  (0x7f800000,
                                                   CONCAT412(0x7f800000,
                                                             CONCAT48(0x7f800000,0x7f8000007f800000)
                                                            ))))));
                                        context = local_2f68;
                                        uVar92 = local_2ea0._0_4_;
                                        auVar184 = local_2cc0;
                                        auVar144 = local_2e20;
                                      }
                                      auVar119 = vpcmpeqd_avx2(local_2d80,_DAT_01faff00);
                                      auVar126 = auVar119 ^ _DAT_01fe9960;
                                      auVar176._8_4_ = 0xff800000;
                                      auVar176._0_8_ = 0xff800000ff800000;
                                      auVar176._12_4_ = 0xff800000;
                                      auVar176._16_4_ = 0xff800000;
                                      auVar176._20_4_ = 0xff800000;
                                      auVar176._24_4_ = 0xff800000;
                                      auVar176._28_4_ = 0xff800000;
                                      auVar119 = vblendvps_avx(auVar176,*(undefined1 (*) [32])
                                                                         (local_2ed0.ray + 0x100),
                                                               auVar119);
                                      *(undefined1 (*) [32])(local_2ed0.ray + 0x100) = auVar119;
                                    }
                                    auVar184 = vblendvps_avx(auVar184,*(undefined1 (*) [32])
                                                                       local_2f08,auVar126);
                                    *(undefined1 (*) [32])local_2f08 = auVar184;
                                    auVar179 = ZEXT3264(local_2ca0);
                                  }
                                  auVar184 = vandnps_avx(auVar126,local_2f40._0_32_);
                                }
                                auVar126 = vandnps_avx(auVar179._0_32_,local_2f40._0_32_);
                                uVar98 = local_2e80._0_8_;
                              }
                              auVar209 = ZEXT3264(auVar184);
                              if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar126 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar126 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar126 >> 0x7f,0) == '\0')
                                    && (auVar126 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar126 >> 0xbf,0) == '\0')
                                  && (auVar126 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar126[0x1f]) {
                                _local_2d20 = auVar144;
                                _local_2d40 = local_2f60;
                                local_2ce0 = local_2da0;
                                local_2dc0 = in_ZMM14._0_32_;
                              }
                              else {
                                local_2dc0 = in_ZMM14._0_32_;
                                local_2e20 = auVar144;
                                auVar126 = *(undefined1 (*) [32])ray;
                                auVar119 = *(undefined1 (*) [32])(ray + 0x20);
                                auVar193 = *(undefined1 (*) [32])(ray + 0x40);
                                auVar86._4_4_ = uStack_26fc;
                                auVar86._0_4_ = local_2700;
                                auVar86._8_4_ = uStack_26f8;
                                auVar86._12_4_ = uStack_26f4;
                                auVar86._16_4_ = uStack_26f0;
                                auVar86._20_4_ = uStack_26ec;
                                auVar86._24_4_ = uStack_26e8;
                                auVar86._28_4_ = uStack_26e4;
                                local_2ea0 = vsubps_avx(auVar86,auVar126);
                                auVar85._4_4_ = uStack_271c;
                                auVar85._0_4_ = local_2720;
                                auVar85._8_4_ = uStack_2718;
                                auVar85._12_4_ = uStack_2714;
                                auVar85._16_4_ = uStack_2710;
                                auVar85._20_4_ = uStack_270c;
                                auVar85._24_4_ = uStack_2708;
                                auVar85._28_4_ = uStack_2704;
                                local_2e40 = vsubps_avx(auVar85,auVar119);
                                auVar84._4_4_ = uStack_273c;
                                auVar84._0_4_ = local_2740;
                                auVar84._8_4_ = uStack_2738;
                                auVar84._12_4_ = uStack_2734;
                                auVar84._16_4_ = uStack_2730;
                                auVar84._20_4_ = uStack_272c;
                                auVar84._24_4_ = uStack_2728;
                                auVar84._28_4_ = uStack_2724;
                                local_2cc0 = vsubps_avx(auVar84,auVar193);
                                auVar194 = vsubps_avx(local_2640,auVar126);
                                auVar120 = vsubps_avx(local_2660,auVar119);
                                auVar118 = vsubps_avx(local_2680,auVar193);
                                auVar125 = vsubps_avx(local_26a0,auVar126);
                                auVar119 = vsubps_avx(local_26c0,auVar119);
                                auVar193 = vsubps_avx(local_26e0,auVar193);
                                local_2ba0 = vsubps_avx(auVar125,local_2ea0);
                                local_2be0 = vsubps_avx(auVar119,local_2e40);
                                _local_2bc0 = vsubps_avx(auVar193,local_2cc0);
                                auVar199._0_4_ = auVar125._0_4_ + local_2ea0._0_4_;
                                auVar199._4_4_ = auVar125._4_4_ + local_2ea0._4_4_;
                                auVar199._8_4_ = auVar125._8_4_ + local_2ea0._8_4_;
                                auVar199._12_4_ = auVar125._12_4_ + local_2ea0._12_4_;
                                auVar199._16_4_ = auVar125._16_4_ + local_2ea0._16_4_;
                                auVar199._20_4_ = auVar125._20_4_ + local_2ea0._20_4_;
                                auVar199._24_4_ = auVar125._24_4_ + local_2ea0._24_4_;
                                fVar139 = local_2ea0._28_4_;
                                auVar199._28_4_ = auVar125._28_4_ + fVar139;
                                local_2d00 = auVar205._0_32_;
                                auVar23 = local_2d00;
                                auVar204._0_4_ = auVar119._0_4_ + local_2e40._0_4_;
                                auVar204._4_4_ = auVar119._4_4_ + local_2e40._4_4_;
                                auVar204._8_4_ = auVar119._8_4_ + local_2e40._8_4_;
                                auVar204._12_4_ = auVar119._12_4_ + local_2e40._12_4_;
                                auVar204._16_4_ = auVar119._16_4_ + local_2e40._16_4_;
                                auVar204._20_4_ = auVar119._20_4_ + local_2e40._20_4_;
                                auVar204._24_4_ = auVar119._24_4_ + local_2e40._24_4_;
                                fVar129 = local_2e40._28_4_;
                                auVar204._28_4_ = auVar119._28_4_ + fVar129;
                                fVar197 = local_2cc0._0_4_;
                                auVar207._0_4_ = fVar197 + auVar193._0_4_;
                                fVar213 = local_2cc0._4_4_;
                                auVar207._4_4_ = fVar213 + auVar193._4_4_;
                                fVar215 = local_2cc0._8_4_;
                                auVar207._8_4_ = fVar215 + auVar193._8_4_;
                                fVar217 = local_2cc0._12_4_;
                                auVar207._12_4_ = fVar217 + auVar193._12_4_;
                                fVar219 = local_2cc0._16_4_;
                                auVar207._16_4_ = fVar219 + auVar193._16_4_;
                                fVar221 = local_2cc0._20_4_;
                                auVar207._20_4_ = fVar221 + auVar193._20_4_;
                                fVar223 = local_2cc0._24_4_;
                                auVar207._24_4_ = fVar223 + auVar193._24_4_;
                                auVar207._28_4_ = local_2cc0._28_4_ + auVar193._28_4_;
                                auVar77._4_4_ = auVar204._4_4_ * local_2bc0._4_4_;
                                auVar77._0_4_ = auVar204._0_4_ * local_2bc0._0_4_;
                                auVar77._8_4_ = auVar204._8_4_ * local_2bc0._8_4_;
                                auVar77._12_4_ = auVar204._12_4_ * local_2bc0._12_4_;
                                auVar77._16_4_ = auVar204._16_4_ * local_2bc0._16_4_;
                                auVar77._20_4_ = auVar204._20_4_ * local_2bc0._20_4_;
                                auVar77._24_4_ = auVar204._24_4_ * local_2bc0._24_4_;
                                auVar77._28_4_ = auVar184._28_4_;
                                auVar140 = vfmsub231ps_fma(auVar77,local_2be0,auVar207);
                                auVar53._4_4_ = auVar207._4_4_ * local_2ba0._4_4_;
                                auVar53._0_4_ = auVar207._0_4_ * local_2ba0._0_4_;
                                auVar53._8_4_ = auVar207._8_4_ * local_2ba0._8_4_;
                                auVar53._12_4_ = auVar207._12_4_ * local_2ba0._12_4_;
                                auVar53._16_4_ = auVar207._16_4_ * local_2ba0._16_4_;
                                auVar53._20_4_ = auVar207._20_4_ * local_2ba0._20_4_;
                                auVar53._24_4_ = auVar207._24_4_ * local_2ba0._24_4_;
                                auVar53._28_4_ = auVar207._28_4_;
                                auVar107 = vfmsub231ps_fma(auVar53,_local_2bc0,auVar199);
                                auVar54._4_4_ = auVar199._4_4_ * local_2be0._4_4_;
                                auVar54._0_4_ = auVar199._0_4_ * local_2be0._0_4_;
                                auVar54._8_4_ = auVar199._8_4_ * local_2be0._8_4_;
                                auVar54._12_4_ = auVar199._12_4_ * local_2be0._12_4_;
                                auVar54._16_4_ = auVar199._16_4_ * local_2be0._16_4_;
                                auVar54._20_4_ = auVar199._20_4_ * local_2be0._20_4_;
                                auVar54._24_4_ = auVar199._24_4_ * local_2be0._24_4_;
                                auVar54._28_4_ = auVar199._28_4_;
                                auVar108 = vfmsub231ps_fma(auVar54,local_2ba0,auVar204);
                                local_2e80._0_32_ = *(undefined1 (*) [32])(ray + 0xc0);
                                auVar209 = ZEXT3264(local_2e80._0_32_);
                                fVar105 = local_2e80._0_4_;
                                fVar127 = local_2e80._4_4_;
                                auVar55._4_4_ = fVar127 * auVar108._4_4_;
                                auVar55._0_4_ = fVar105 * auVar108._0_4_;
                                fVar130 = local_2e80._8_4_;
                                auVar55._8_4_ = fVar130 * auVar108._8_4_;
                                fVar133 = local_2e80._12_4_;
                                auVar55._12_4_ = fVar133 * auVar108._12_4_;
                                fVar136 = local_2e80._16_4_;
                                auVar55._16_4_ = fVar136 * 0.0;
                                fVar137 = local_2e80._20_4_;
                                auVar55._20_4_ = fVar137 * 0.0;
                                fVar138 = local_2e80._24_4_;
                                auVar55._24_4_ = fVar138 * 0.0;
                                auVar55._28_4_ = local_2be0._28_4_;
                                auVar126 = *(undefined1 (*) [32])(ray + 0xa0);
                                auVar107 = vfmadd231ps_fma(auVar55,auVar126,ZEXT1632(auVar107));
                                local_2ca0 = *(undefined1 (*) [32])(ray + 0x80);
                                auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_2ca0,
                                                           ZEXT1632(auVar140));
                                local_2c00 = vsubps_avx(local_2e40,auVar120);
                                auVar183 = vsubps_avx(local_2cc0,auVar118);
                                auVar226._0_4_ = auVar120._0_4_ + local_2e40._0_4_;
                                auVar226._4_4_ = auVar120._4_4_ + local_2e40._4_4_;
                                auVar226._8_4_ = auVar120._8_4_ + local_2e40._8_4_;
                                auVar226._12_4_ = auVar120._12_4_ + local_2e40._12_4_;
                                auVar226._16_4_ = auVar120._16_4_ + local_2e40._16_4_;
                                auVar226._20_4_ = auVar120._20_4_ + local_2e40._20_4_;
                                auVar226._24_4_ = auVar120._24_4_ + local_2e40._24_4_;
                                auVar226._28_4_ = auVar120._28_4_ + fVar129;
                                auVar122._0_4_ = fVar197 + auVar118._0_4_;
                                auVar122._4_4_ = fVar213 + auVar118._4_4_;
                                auVar122._8_4_ = fVar215 + auVar118._8_4_;
                                auVar122._12_4_ = fVar217 + auVar118._12_4_;
                                auVar122._16_4_ = fVar219 + auVar118._16_4_;
                                auVar122._20_4_ = fVar221 + auVar118._20_4_;
                                auVar122._24_4_ = fVar223 + auVar118._24_4_;
                                auVar122._28_4_ = local_2cc0._28_4_ + auVar118._28_4_;
                                fVar132 = auVar183._0_4_;
                                fVar135 = auVar183._4_4_;
                                auVar56._4_4_ = auVar226._4_4_ * fVar135;
                                auVar56._0_4_ = auVar226._0_4_ * fVar132;
                                fVar13 = auVar183._8_4_;
                                auVar56._8_4_ = auVar226._8_4_ * fVar13;
                                fVar106 = auVar183._12_4_;
                                auVar56._12_4_ = auVar226._12_4_ * fVar106;
                                fVar131 = auVar183._16_4_;
                                auVar56._16_4_ = auVar226._16_4_ * fVar131;
                                fVar15 = auVar183._20_4_;
                                auVar56._20_4_ = auVar226._20_4_ * fVar15;
                                fVar17 = auVar183._24_4_;
                                auVar56._24_4_ = auVar226._24_4_ * fVar17;
                                auVar56._28_4_ = fVar129;
                                auVar108 = vfmsub231ps_fma(auVar56,local_2c00,auVar122);
                                auVar19 = vsubps_avx(local_2ea0,auVar194);
                                fVar211 = auVar19._0_4_;
                                fVar214 = auVar19._4_4_;
                                auVar57._4_4_ = fVar214 * auVar122._4_4_;
                                auVar57._0_4_ = fVar211 * auVar122._0_4_;
                                fVar216 = auVar19._8_4_;
                                auVar57._8_4_ = fVar216 * auVar122._8_4_;
                                fVar218 = auVar19._12_4_;
                                auVar57._12_4_ = fVar218 * auVar122._12_4_;
                                fVar220 = auVar19._16_4_;
                                auVar57._16_4_ = fVar220 * auVar122._16_4_;
                                fVar222 = auVar19._20_4_;
                                auVar57._20_4_ = fVar222 * auVar122._20_4_;
                                fVar224 = auVar19._24_4_;
                                auVar57._24_4_ = fVar224 * auVar122._24_4_;
                                auVar57._28_4_ = auVar122._28_4_;
                                auVar188._0_4_ = auVar194._0_4_ + local_2ea0._0_4_;
                                auVar188._4_4_ = auVar194._4_4_ + local_2ea0._4_4_;
                                auVar188._8_4_ = auVar194._8_4_ + local_2ea0._8_4_;
                                auVar188._12_4_ = auVar194._12_4_ + local_2ea0._12_4_;
                                auVar188._16_4_ = auVar194._16_4_ + local_2ea0._16_4_;
                                auVar188._20_4_ = auVar194._20_4_ + local_2ea0._20_4_;
                                auVar188._24_4_ = auVar194._24_4_ + local_2ea0._24_4_;
                                auVar188._28_4_ = auVar194._28_4_ + fVar139;
                                auVar140 = vfmsub231ps_fma(auVar57,auVar183,auVar188);
                                fVar129 = local_2c00._0_4_;
                                fVar12 = local_2c00._4_4_;
                                auVar58._4_4_ = auVar188._4_4_ * fVar12;
                                auVar58._0_4_ = auVar188._0_4_ * fVar129;
                                fVar14 = local_2c00._8_4_;
                                auVar58._8_4_ = auVar188._8_4_ * fVar14;
                                fVar128 = local_2c00._12_4_;
                                auVar58._12_4_ = auVar188._12_4_ * fVar128;
                                fVar134 = local_2c00._16_4_;
                                auVar58._16_4_ = auVar188._16_4_ * fVar134;
                                fVar16 = local_2c00._20_4_;
                                auVar58._20_4_ = auVar188._20_4_ * fVar16;
                                fVar18 = local_2c00._24_4_;
                                auVar58._24_4_ = auVar188._24_4_ * fVar18;
                                auVar58._28_4_ = auVar188._28_4_;
                                auVar109 = vfmsub231ps_fma(auVar58,auVar19,auVar226);
                                auVar189._0_4_ = fVar105 * auVar109._0_4_;
                                auVar189._4_4_ = fVar127 * auVar109._4_4_;
                                auVar189._8_4_ = fVar130 * auVar109._8_4_;
                                auVar189._12_4_ = fVar133 * auVar109._12_4_;
                                auVar189._16_4_ = fVar136 * 0.0;
                                auVar189._20_4_ = fVar137 * 0.0;
                                auVar189._24_4_ = fVar138 * 0.0;
                                auVar189._28_4_ = 0;
                                auVar140 = vfmadd231ps_fma(auVar189,auVar126,ZEXT1632(auVar140));
                                auVar200 = ZEXT3264(local_2ca0);
                                auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),local_2ca0,
                                                           ZEXT1632(auVar108));
                                auVar21 = vsubps_avx(auVar194,auVar125);
                                in_ZMM14 = ZEXT3264(auVar21);
                                auVar123._0_4_ = auVar194._0_4_ + auVar125._0_4_;
                                auVar123._4_4_ = auVar194._4_4_ + auVar125._4_4_;
                                auVar123._8_4_ = auVar194._8_4_ + auVar125._8_4_;
                                auVar123._12_4_ = auVar194._12_4_ + auVar125._12_4_;
                                auVar123._16_4_ = auVar194._16_4_ + auVar125._16_4_;
                                auVar123._20_4_ = auVar194._20_4_ + auVar125._20_4_;
                                auVar123._24_4_ = auVar194._24_4_ + auVar125._24_4_;
                                auVar123._28_4_ = auVar194._28_4_ + auVar125._28_4_;
                                auVar125 = vsubps_avx(auVar120,auVar119);
                                auVar156._0_4_ = auVar120._0_4_ + auVar119._0_4_;
                                auVar156._4_4_ = auVar120._4_4_ + auVar119._4_4_;
                                auVar156._8_4_ = auVar120._8_4_ + auVar119._8_4_;
                                auVar156._12_4_ = auVar120._12_4_ + auVar119._12_4_;
                                auVar156._16_4_ = auVar120._16_4_ + auVar119._16_4_;
                                auVar156._20_4_ = auVar120._20_4_ + auVar119._20_4_;
                                auVar156._24_4_ = auVar120._24_4_ + auVar119._24_4_;
                                auVar156._28_4_ = auVar120._28_4_ + auVar119._28_4_;
                                auVar20 = vsubps_avx(auVar118,auVar193);
                                auVar172._0_4_ = auVar118._0_4_ + auVar193._0_4_;
                                auVar172._4_4_ = auVar118._4_4_ + auVar193._4_4_;
                                auVar172._8_4_ = auVar118._8_4_ + auVar193._8_4_;
                                auVar172._12_4_ = auVar118._12_4_ + auVar193._12_4_;
                                auVar172._16_4_ = auVar118._16_4_ + auVar193._16_4_;
                                auVar172._20_4_ = auVar118._20_4_ + auVar193._20_4_;
                                auVar172._24_4_ = auVar118._24_4_ + auVar193._24_4_;
                                auVar172._28_4_ = auVar118._28_4_ + auVar193._28_4_;
                                auVar59._4_4_ = auVar20._4_4_ * auVar156._4_4_;
                                auVar59._0_4_ = auVar20._0_4_ * auVar156._0_4_;
                                auVar59._8_4_ = auVar20._8_4_ * auVar156._8_4_;
                                auVar59._12_4_ = auVar20._12_4_ * auVar156._12_4_;
                                auVar59._16_4_ = auVar20._16_4_ * auVar156._16_4_;
                                auVar59._20_4_ = auVar20._20_4_ * auVar156._20_4_;
                                auVar59._24_4_ = auVar20._24_4_ * auVar156._24_4_;
                                auVar59._28_4_ = fVar139;
                                auVar109 = vfmsub231ps_fma(auVar59,auVar125,auVar172);
                                auVar60._4_4_ = auVar21._4_4_ * auVar172._4_4_;
                                auVar60._0_4_ = auVar21._0_4_ * auVar172._0_4_;
                                auVar60._8_4_ = auVar21._8_4_ * auVar172._8_4_;
                                auVar60._12_4_ = auVar21._12_4_ * auVar172._12_4_;
                                auVar60._16_4_ = auVar21._16_4_ * auVar172._16_4_;
                                auVar60._20_4_ = auVar21._20_4_ * auVar172._20_4_;
                                auVar60._24_4_ = auVar21._24_4_ * auVar172._24_4_;
                                auVar60._28_4_ = auVar172._28_4_;
                                auVar108 = vfmsub231ps_fma(auVar60,auVar20,auVar123);
                                auVar61._4_4_ = auVar125._4_4_ * auVar123._4_4_;
                                auVar61._0_4_ = auVar125._0_4_ * auVar123._0_4_;
                                auVar61._8_4_ = auVar125._8_4_ * auVar123._8_4_;
                                auVar61._12_4_ = auVar125._12_4_ * auVar123._12_4_;
                                auVar61._16_4_ = auVar125._16_4_ * auVar123._16_4_;
                                auVar61._20_4_ = auVar125._20_4_ * auVar123._20_4_;
                                auVar61._24_4_ = auVar125._24_4_ * auVar123._24_4_;
                                auVar61._28_4_ = auVar123._28_4_;
                                auVar110 = vfmsub231ps_fma(auVar61,auVar21,auVar156);
                                auVar124._0_4_ = fVar105 * auVar110._0_4_;
                                auVar124._4_4_ = fVar127 * auVar110._4_4_;
                                auVar124._8_4_ = fVar130 * auVar110._8_4_;
                                auVar124._12_4_ = fVar133 * auVar110._12_4_;
                                auVar124._16_4_ = fVar136 * 0.0;
                                auVar124._20_4_ = fVar137 * 0.0;
                                auVar124._24_4_ = fVar138 * 0.0;
                                auVar124._28_4_ = 0;
                                auVar108 = vfmadd231ps_fma(auVar124,auVar126,ZEXT1632(auVar108));
                                auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),local_2ca0,
                                                           ZEXT1632(auVar109));
                                local_2ce0 = ZEXT1632(CONCAT412(auVar108._12_4_ +
                                                                auVar107._12_4_ + auVar140._12_4_,
                                                                CONCAT48(auVar108._8_4_ +
                                                                         auVar107._8_4_ +
                                                                         auVar140._8_4_,
                                                                         CONCAT44(auVar108._4_4_ +
                                                                                  auVar107._4_4_ +
                                                                                  auVar140._4_4_,
                                                                                  auVar108._0_4_ +
                                                                                  auVar107._0_4_ +
                                                                                  auVar140._0_4_))))
                                ;
                                auVar119 = vandps_avx(local_2ce0,local_2b60);
                                fVar139 = auVar119._0_4_ * 1.1920929e-07;
                                fVar160 = auVar119._4_4_ * 1.1920929e-07;
                                auVar62._4_4_ = fVar160;
                                auVar62._0_4_ = fVar139;
                                fVar161 = auVar119._8_4_ * 1.1920929e-07;
                                auVar62._8_4_ = fVar161;
                                fVar162 = auVar119._12_4_ * 1.1920929e-07;
                                auVar62._12_4_ = fVar162;
                                fVar163 = auVar119._16_4_ * 1.1920929e-07;
                                auVar62._16_4_ = fVar163;
                                fVar164 = auVar119._20_4_ * 1.1920929e-07;
                                auVar62._20_4_ = fVar164;
                                fVar165 = auVar119._24_4_ * 1.1920929e-07;
                                auVar62._24_4_ = fVar165;
                                auVar62._28_4_ = auVar119._28_4_;
                                _local_2d20 = ZEXT1632(auVar107);
                                auVar193 = vminps_avx(_local_2d20,ZEXT1632(auVar140));
                                auVar193 = vminps_avx(auVar193,ZEXT1632(auVar108));
                                local_2d00._0_4_ = auVar205._0_4_;
                                local_2d00._4_4_ = auVar205._4_4_;
                                local_2d00._8_4_ = auVar205._8_4_;
                                local_2d00._12_4_ = auVar205._12_4_;
                                local_2d00._16_4_ = auVar205._16_4_;
                                local_2d00._20_4_ = auVar205._20_4_;
                                local_2d00._24_4_ = auVar205._24_4_;
                                local_2d00._28_4_ = auVar205._28_4_;
                                auVar182._0_4_ = (uint)fVar139 ^ local_2d00._0_4_;
                                auVar182._4_4_ = (uint)fVar160 ^ local_2d00._4_4_;
                                auVar182._8_4_ = (uint)fVar161 ^ local_2d00._8_4_;
                                auVar182._12_4_ = (uint)fVar162 ^ local_2d00._12_4_;
                                auVar182._16_4_ = (uint)fVar163 ^ local_2d00._16_4_;
                                auVar182._20_4_ = (uint)fVar164 ^ local_2d00._20_4_;
                                auVar182._24_4_ = (uint)fVar165 ^ local_2d00._24_4_;
                                auVar182._28_4_ = auVar119._28_4_ ^ local_2d00._28_4_;
                                auVar193 = vcmpps_avx(auVar193,auVar182,5);
                                auVar179 = ZEXT3264(auVar193);
                                _local_2d40 = ZEXT1632(auVar140);
                                auVar194 = vmaxps_avx(_local_2d20,ZEXT1632(auVar140));
                                auVar119 = vmaxps_avx(auVar194,ZEXT1632(auVar108));
                                auVar119 = vcmpps_avx(auVar119,auVar62,2);
                                auVar120 = vorps_avx(auVar193,auVar119);
                                auVar118 = auVar184 & auVar120;
                                auVar119 = vandps_avx(auVar120,auVar184);
                                if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0 &&
                                         (auVar118 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar118 >> 0x5f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar118 >> 0x7f,0) == '\0'
                                       ) && (auVar118 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                     SUB321(auVar118 >> 0xbf,0) == '\0') &&
                                    (auVar118 & (undefined1  [32])0x100000000) ==
                                    (undefined1  [32])0x0) && -1 < auVar118[0x1f]) {
                                  auVar159 = ZEXT3264(auVar119);
LAB_019d91fc:
                                  _local_2d20 = auVar144;
                                  _local_2d40 = local_2f60;
                                  local_2ce0 = local_2da0;
                                  auVar205 = auVar209;
                                }
                                else {
                                  auVar200 = ZEXT3264(local_2c00);
                                  auVar63._4_4_ = fVar12 * local_2bc0._4_4_;
                                  auVar63._0_4_ = fVar129 * local_2bc0._0_4_;
                                  auVar63._8_4_ = fVar14 * local_2bc0._8_4_;
                                  auVar63._12_4_ = fVar128 * local_2bc0._12_4_;
                                  auVar63._16_4_ = fVar134 * local_2bc0._16_4_;
                                  auVar63._20_4_ = fVar16 * local_2bc0._20_4_;
                                  auVar63._24_4_ = fVar18 * local_2bc0._24_4_;
                                  auVar63._28_4_ = auVar120._28_4_;
                                  auVar64._4_4_ = fVar214 * local_2be0._4_4_;
                                  auVar64._0_4_ = fVar211 * local_2be0._0_4_;
                                  auVar64._8_4_ = fVar216 * local_2be0._8_4_;
                                  auVar64._12_4_ = fVar218 * local_2be0._12_4_;
                                  auVar64._16_4_ = fVar220 * local_2be0._16_4_;
                                  auVar64._20_4_ = fVar222 * local_2be0._20_4_;
                                  auVar64._24_4_ = fVar224 * local_2be0._24_4_;
                                  auVar64._28_4_ = auVar184._28_4_;
                                  auVar107 = vfmsub213ps_fma(local_2be0,auVar183,auVar63);
                                  auVar65._4_4_ = auVar125._4_4_ * fVar135;
                                  auVar65._0_4_ = auVar125._0_4_ * fVar132;
                                  auVar65._8_4_ = auVar125._8_4_ * fVar13;
                                  auVar65._12_4_ = auVar125._12_4_ * fVar106;
                                  auVar65._16_4_ = auVar125._16_4_ * fVar131;
                                  auVar65._20_4_ = auVar125._20_4_ * fVar15;
                                  auVar65._24_4_ = auVar125._24_4_ * fVar17;
                                  auVar65._28_4_ = auVar193._28_4_;
                                  auVar66._4_4_ = fVar214 * auVar20._4_4_;
                                  auVar66._0_4_ = fVar211 * auVar20._0_4_;
                                  auVar66._8_4_ = fVar216 * auVar20._8_4_;
                                  auVar66._12_4_ = fVar218 * auVar20._12_4_;
                                  auVar66._16_4_ = fVar220 * auVar20._16_4_;
                                  auVar66._20_4_ = fVar222 * auVar20._20_4_;
                                  auVar66._24_4_ = fVar224 * auVar20._24_4_;
                                  auVar66._28_4_ = auVar194._28_4_;
                                  auVar140 = vfmsub213ps_fma(auVar20,local_2c00,auVar65);
                                  auVar193 = vandps_avx(auVar63,local_2b60);
                                  auVar194 = vandps_avx(auVar65,local_2b60);
                                  auVar193 = vcmpps_avx(auVar193,auVar194,1);
                                  auVar120 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar107),
                                                           auVar193);
                                  auVar67._4_4_ = auVar21._4_4_ * fVar12;
                                  auVar67._0_4_ = auVar21._0_4_ * fVar129;
                                  auVar67._8_4_ = auVar21._8_4_ * fVar14;
                                  auVar67._12_4_ = auVar21._12_4_ * fVar128;
                                  auVar67._16_4_ = auVar21._16_4_ * fVar134;
                                  auVar67._20_4_ = auVar21._20_4_ * fVar16;
                                  auVar67._24_4_ = auVar21._24_4_ * fVar18;
                                  auVar67._28_4_ = auVar193._28_4_;
                                  auVar107 = vfmsub213ps_fma(auVar21,auVar183,auVar66);
                                  in_ZMM14 = ZEXT1664(auVar107);
                                  auVar68._4_4_ = fVar135 * local_2ba0._4_4_;
                                  auVar68._0_4_ = fVar132 * local_2ba0._0_4_;
                                  auVar68._8_4_ = fVar13 * local_2ba0._8_4_;
                                  auVar68._12_4_ = fVar106 * local_2ba0._12_4_;
                                  auVar68._16_4_ = fVar131 * local_2ba0._16_4_;
                                  auVar68._20_4_ = fVar15 * local_2ba0._20_4_;
                                  auVar68._24_4_ = fVar17 * local_2ba0._24_4_;
                                  auVar68._28_4_ = auVar194._28_4_;
                                  auVar140 = vfmsub213ps_fma(_local_2bc0,auVar19,auVar68);
                                  auVar193 = vandps_avx(auVar68,local_2b60);
                                  auVar194 = vandps_avx(auVar66,local_2b60);
                                  auVar193 = vcmpps_avx(auVar193,auVar194,1);
                                  auVar118 = vblendvps_avx(ZEXT1632(auVar107),ZEXT1632(auVar140),
                                                           auVar193);
                                  auVar107 = vfmsub213ps_fma(local_2ba0,local_2c00,auVar64);
                                  auVar140 = vfmsub213ps_fma(auVar125,auVar19,auVar67);
                                  auVar193 = vandps_avx(auVar64,local_2b60);
                                  auVar194 = vandps_avx(auVar67,local_2b60);
                                  auVar125 = vcmpps_avx(auVar193,auVar194,1);
                                  auVar194 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar107),
                                                           auVar125);
                                  auVar69._4_4_ = auVar194._4_4_ * fVar127;
                                  auVar69._0_4_ = auVar194._0_4_ * fVar105;
                                  auVar69._8_4_ = auVar194._8_4_ * fVar130;
                                  auVar69._12_4_ = auVar194._12_4_ * fVar133;
                                  auVar69._16_4_ = auVar194._16_4_ * fVar136;
                                  auVar69._20_4_ = auVar194._20_4_ * fVar137;
                                  auVar69._24_4_ = auVar194._24_4_ * fVar138;
                                  auVar69._28_4_ = auVar125._28_4_;
                                  auVar107 = vfmadd213ps_fma(auVar126,auVar118,auVar69);
                                  auVar107 = vfmadd213ps_fma(local_2ca0,auVar120,ZEXT1632(auVar107))
                                  ;
                                  auVar209 = ZEXT1664(auVar107);
                                  fVar139 = auVar107._0_4_ + auVar107._0_4_;
                                  fVar129 = auVar107._4_4_ + auVar107._4_4_;
                                  fVar132 = auVar107._8_4_ + auVar107._8_4_;
                                  fVar135 = auVar107._12_4_ + auVar107._12_4_;
                                  auVar125 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar132,CONCAT44(
                                                  fVar129,fVar139))));
                                  auVar70._4_4_ = auVar194._4_4_ * fVar213;
                                  auVar70._0_4_ = auVar194._0_4_ * fVar197;
                                  auVar70._8_4_ = auVar194._8_4_ * fVar215;
                                  auVar70._12_4_ = auVar194._12_4_ * fVar217;
                                  auVar70._16_4_ = auVar194._16_4_ * fVar219;
                                  auVar70._20_4_ = auVar194._20_4_ * fVar221;
                                  auVar70._24_4_ = auVar194._24_4_ * fVar223;
                                  auVar70._28_4_ = auVar193._28_4_;
                                  auVar107 = vfmadd213ps_fma(local_2e40,auVar118,auVar70);
                                  auVar140 = vfmadd213ps_fma(local_2ea0,auVar120,ZEXT1632(auVar107))
                                  ;
                                  auVar126 = vrcpps_avx(auVar125);
                                  auVar190._8_4_ = 0x3f800000;
                                  auVar190._0_8_ = 0x3f8000003f800000;
                                  auVar190._12_4_ = 0x3f800000;
                                  auVar190._16_4_ = 0x3f800000;
                                  auVar190._20_4_ = 0x3f800000;
                                  auVar190._24_4_ = 0x3f800000;
                                  auVar190._28_4_ = 0x3f800000;
                                  auVar107 = vfnmadd213ps_fma(auVar126,auVar125,auVar190);
                                  auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar126,auVar126);
                                  auVar183 = ZEXT1632(CONCAT412((auVar140._12_4_ + auVar140._12_4_)
                                                                * auVar107._12_4_,
                                                                CONCAT48((auVar140._8_4_ +
                                                                         auVar140._8_4_) *
                                                                         auVar107._8_4_,
                                                                         CONCAT44((auVar140._4_4_ +
                                                                                  auVar140._4_4_) *
                                                                                  auVar107._4_4_,
                                                                                  (auVar140._0_4_ +
                                                                                  auVar140._0_4_) *
                                                                                  auVar107._0_4_))))
                                  ;
                                  auVar126 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar183,
                                                        2);
                                  auVar193 = vcmpps_avx(auVar183,*(undefined1 (*) [32])(ray + 0x100)
                                                        ,2);
                                  auVar126 = vandps_avx(auVar126,auVar193);
                                  auVar173._0_4_ = (uint)fVar139 ^ local_2d00._0_4_;
                                  auVar173._4_4_ = (uint)fVar129 ^ local_2d00._4_4_;
                                  auVar173._8_4_ = (uint)fVar132 ^ local_2d00._8_4_;
                                  auVar173._12_4_ = (uint)fVar135 ^ local_2d00._12_4_;
                                  auVar173._16_4_ = local_2d00._16_4_;
                                  auVar173._20_4_ = local_2d00._20_4_;
                                  auVar173._24_4_ = local_2d00._24_4_;
                                  auVar173._28_4_ = local_2d00._28_4_;
                                  auVar179 = ZEXT3264(auVar173);
                                  auVar193 = vcmpps_avx(auVar125,auVar173,4);
                                  auVar126 = vandps_avx(auVar193,auVar126);
                                  auVar126 = vpslld_avx2(auVar126,0x1f);
                                  auVar126 = vpsrad_avx2(auVar126,0x1f);
                                  auVar193 = auVar119 & auVar126;
                                  auVar126 = vandps_avx(auVar119,auVar126);
                                  auVar159 = ZEXT3264(auVar126);
                                  if ((((((((auVar193 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar193 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar193 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar193 >> 0x7f,0) == '\0') &&
                                        (auVar193 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && SUB321(auVar193 >> 0xbf,0) == '\0'
                                       ) && (auVar193 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) && -1 < auVar193[0x1f])
                                  goto LAB_019d91fc;
                                  local_2e00 = auVar183;
                                  local_2de0 = auVar194;
                                  local_2dc0 = auVar118;
                                  auVar205 = auVar209;
                                  local_2f00 = auVar120;
                                }
                                auVar212 = ZEXT3264(CONCAT428(0x7f800000,
                                                              CONCAT424(0x7f800000,
                                                                        CONCAT420(0x7f800000,
                                                                                  CONCAT416(
                                                  0x7f800000,
                                                  CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                  )))));
                                auVar126 = auVar159._0_32_;
                                local_2f40._0_32_ = auVar184;
                                local_2d00 = auVar23;
                                if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar126 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar126 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar126 >> 0x7f,0) != '\0'
                                       ) || (auVar159 & (undefined1  [64])0x100000000) !=
                                            (undefined1  [64])0x0) ||
                                     SUB321(auVar126 >> 0xbf,0) != '\0') ||
                                    (auVar159 & (undefined1  [64])0x100000000) !=
                                    (undefined1  [64])0x0) || auVar159[0x1f] < '\0') {
                                  auVar205 = ZEXT3264(local_2ce0);
                                  auVar144 = vsubps_avx(local_2ce0,_local_2d20);
                                  auVar119 = vsubps_avx(local_2ce0,_local_2d40);
                                  auVar180._0_4_ =
                                       (float)(int)(*(ushort *)(lVar22 + 8 + lVar99) - 1);
                                  auVar180._4_8_ = SUB128(ZEXT812(0),4);
                                  auVar180._12_4_ = 0;
                                  auVar107 = vrcpss_avx(auVar180,auVar180);
                                  auVar108 = ZEXT416((uint)(float)(int)(*(ushort *)
                                                                         (lVar22 + 10 + lVar99) - 1)
                                                    );
                                  auVar200 = ZEXT464(0x40000000);
                                  auVar109 = auVar200._0_16_;
                                  auVar140 = vfnmadd213ss_fma(auVar180,auVar107,auVar109);
                                  fVar139 = auVar107._0_4_ * auVar140._0_4_;
                                  auVar107 = vrcpss_avx(auVar108,auVar108);
                                  auVar140 = vfnmadd213ss_fma(auVar108,auVar107,auVar109);
                                  fVar129 = auVar107._0_4_ * auVar140._0_4_;
                                  fVar132 = (float)(int)(((uint)uVar98 & 1) + uVar90);
                                  auVar71._4_4_ =
                                       (auVar144._4_4_ + local_2ce0._4_4_ * fVar132) * fVar139;
                                  auVar71._0_4_ =
                                       (auVar144._0_4_ + local_2ce0._0_4_ * fVar132) * fVar139;
                                  auVar71._8_4_ =
                                       (auVar144._8_4_ + local_2ce0._8_4_ * fVar132) * fVar139;
                                  auVar71._12_4_ =
                                       (auVar144._12_4_ + local_2ce0._12_4_ * fVar132) * fVar139;
                                  auVar71._16_4_ =
                                       (auVar144._16_4_ + local_2ce0._16_4_ * fVar132) * fVar139;
                                  auVar71._20_4_ =
                                       (auVar144._20_4_ + local_2ce0._20_4_ * fVar132) * fVar139;
                                  auVar71._24_4_ =
                                       (auVar144._24_4_ + local_2ce0._24_4_ * fVar132) * fVar139;
                                  auVar71._28_4_ = fVar139;
                                  _local_2d20 = vblendvps_avx(auVar144,auVar71,auVar126);
                                  auVar194 = _local_2d20;
                                  in_ZMM14 = ZEXT1664(ZEXT416(0) << 0x20);
                                  fVar139 = (float)(int)(((uint)(uVar98 >> 1) & 0x7fffffff) + uVar92
                                                        );
                                  auVar72._4_4_ =
                                       (auVar119._4_4_ + local_2ce0._4_4_ * fVar139) * fVar129;
                                  auVar72._0_4_ =
                                       (auVar119._0_4_ + local_2ce0._0_4_ * fVar139) * fVar129;
                                  auVar72._8_4_ =
                                       (auVar119._8_4_ + local_2ce0._8_4_ * fVar139) * fVar129;
                                  auVar72._12_4_ =
                                       (auVar119._12_4_ + local_2ce0._12_4_ * fVar139) * fVar129;
                                  auVar72._16_4_ =
                                       (auVar119._16_4_ + local_2ce0._16_4_ * fVar139) * fVar129;
                                  auVar72._20_4_ =
                                       (auVar119._20_4_ + local_2ce0._20_4_ * fVar139) * fVar129;
                                  auVar72._24_4_ =
                                       (auVar119._24_4_ + local_2ce0._24_4_ * fVar139) * fVar129;
                                  auVar72._28_4_ = auVar119._28_4_ + fVar139;
                                  auVar179 = ZEXT3264(auVar72);
                                  _local_2d40 = vblendvps_avx(auVar119,auVar72,auVar126);
                                  auVar193 = _local_2d40;
                                  uVar7 = *(uint *)(local_2d50 + uVar98 * 4);
                                  pGVar8 = (context->scene->geometries).items[uVar7].ptr;
                                  uVar89 = pGVar8->mask;
                                  auVar157._4_4_ = uVar89;
                                  auVar157._0_4_ = uVar89;
                                  auVar157._8_4_ = uVar89;
                                  auVar157._12_4_ = uVar89;
                                  auVar157._16_4_ = uVar89;
                                  auVar157._20_4_ = uVar89;
                                  auVar157._24_4_ = uVar89;
                                  auVar157._28_4_ = uVar89;
                                  auVar144 = vpand_avx2(auVar157,*(undefined1 (*) [32])(ray + 0x120)
                                                       );
                                  auVar119 = vpcmpeqd_avx2(auVar144,_DAT_01faff00);
                                  auVar144 = auVar126 & ~auVar119;
                                  if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar144 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar144 >> 0x5f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar144 >> 0x7f,0) != '\0') ||
                                        (auVar144 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || SUB321(auVar144 >> 0xbf,0) != '\0'
                                       ) || (auVar144 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) || auVar144[0x1f] < '\0') {
                                    local_2e80._0_8_ = uVar98;
                                    uVar103 = *(undefined4 *)(local_2d60 + uVar98 * 4);
                                    auVar126 = vandnps_avx(auVar119,auVar126);
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      local_2ea0._0_4_ = uVar92;
                                      local_2e40._0_4_ = uVar90;
                                      auVar144 = vandps_avx(local_2ce0,local_2b60);
                                      auVar184 = vrcpps_avx(local_2ce0);
                                      auVar192._8_4_ = 0x3f800000;
                                      auVar192._0_8_ = 0x3f8000003f800000;
                                      auVar192._12_4_ = 0x3f800000;
                                      auVar192._16_4_ = 0x3f800000;
                                      auVar192._20_4_ = 0x3f800000;
                                      auVar192._24_4_ = 0x3f800000;
                                      auVar192._28_4_ = 0x3f800000;
                                      auVar107 = vfnmadd213ps_fma(auVar184,local_2ce0,auVar192);
                                      auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar184,
                                                                 auVar184);
                                      auVar175._8_4_ = 0x219392ef;
                                      auVar175._0_8_ = 0x219392ef219392ef;
                                      auVar175._12_4_ = 0x219392ef;
                                      auVar175._16_4_ = 0x219392ef;
                                      auVar175._20_4_ = 0x219392ef;
                                      auVar175._24_4_ = 0x219392ef;
                                      auVar175._28_4_ = 0x219392ef;
                                      auVar144 = vcmpps_avx(auVar144,auVar175,5);
                                      auVar144 = vandps_avx(auVar144,ZEXT1632(auVar107));
                                      auVar75._4_4_ = auVar144._4_4_ * (float)local_2d20._4_4_;
                                      auVar75._0_4_ = auVar144._0_4_ * (float)local_2d20._0_4_;
                                      auVar75._8_4_ = auVar144._8_4_ * fStack_2d18;
                                      auVar75._12_4_ = auVar144._12_4_ * fStack_2d14;
                                      auVar75._16_4_ = auVar144._16_4_ * fStack_2d10;
                                      auVar75._20_4_ = auVar144._20_4_ * fStack_2d0c;
                                      auVar75._24_4_ = auVar144._24_4_ * fStack_2d08;
                                      auVar75._28_4_ = 0x219392ef;
                                      auVar184 = vminps_avx(auVar75,auVar192);
                                      auVar76._4_4_ = auVar144._4_4_ * (float)local_2d40._4_4_;
                                      auVar76._0_4_ = auVar144._0_4_ * (float)local_2d40._0_4_;
                                      auVar76._8_4_ = auVar144._8_4_ * fStack_2d38;
                                      auVar76._12_4_ = auVar144._12_4_ * fStack_2d34;
                                      auVar76._16_4_ = auVar144._16_4_ * fStack_2d30;
                                      auVar76._20_4_ = auVar144._20_4_ * fStack_2d2c;
                                      auVar76._24_4_ = auVar144._24_4_ * fStack_2d28;
                                      auVar76._28_4_ = auVar144._28_4_;
                                      local_2900 = vminps_avx(auVar76,auVar192);
                                      pRVar11 = context->user;
                                      local_2980[0] = (RTCHitN)local_2f00[0];
                                      local_2980[1] = (RTCHitN)local_2f00[1];
                                      local_2980[2] = (RTCHitN)local_2f00[2];
                                      local_2980[3] = (RTCHitN)local_2f00[3];
                                      local_2980[4] = (RTCHitN)local_2f00[4];
                                      local_2980[5] = (RTCHitN)local_2f00[5];
                                      local_2980[6] = (RTCHitN)local_2f00[6];
                                      local_2980[7] = (RTCHitN)local_2f00[7];
                                      local_2980[8] = (RTCHitN)local_2f00[8];
                                      local_2980[9] = (RTCHitN)local_2f00[9];
                                      local_2980[10] = (RTCHitN)local_2f00[10];
                                      local_2980[0xb] = (RTCHitN)local_2f00[0xb];
                                      local_2980[0xc] = (RTCHitN)local_2f00[0xc];
                                      local_2980[0xd] = (RTCHitN)local_2f00[0xd];
                                      local_2980[0xe] = (RTCHitN)local_2f00[0xe];
                                      local_2980[0xf] = (RTCHitN)local_2f00[0xf];
                                      local_2980[0x10] = (RTCHitN)local_2f00[0x10];
                                      local_2980[0x11] = (RTCHitN)local_2f00[0x11];
                                      local_2980[0x12] = (RTCHitN)local_2f00[0x12];
                                      local_2980[0x13] = (RTCHitN)local_2f00[0x13];
                                      local_2980[0x14] = (RTCHitN)local_2f00[0x14];
                                      local_2980[0x15] = (RTCHitN)local_2f00[0x15];
                                      local_2980[0x16] = (RTCHitN)local_2f00[0x16];
                                      local_2980[0x17] = (RTCHitN)local_2f00[0x17];
                                      local_2980[0x18] = (RTCHitN)local_2f00[0x18];
                                      local_2980[0x19] = (RTCHitN)local_2f00[0x19];
                                      local_2980[0x1a] = (RTCHitN)local_2f00[0x1a];
                                      local_2980[0x1b] = (RTCHitN)local_2f00[0x1b];
                                      local_2980[0x1c] = (RTCHitN)local_2f00[0x1c];
                                      local_2980[0x1d] = (RTCHitN)local_2f00[0x1d];
                                      local_2980[0x1e] = (RTCHitN)local_2f00[0x1e];
                                      local_2980[0x1f] = (RTCHitN)local_2f00[0x1f];
                                      local_2960 = local_2dc0;
                                      local_2940 = local_2de0;
                                      local_2920 = auVar184;
                                      local_28e0 = uVar103;
                                      uStack_28dc = uVar103;
                                      uStack_28d8 = uVar103;
                                      uStack_28d4 = uVar103;
                                      uStack_28d0 = uVar103;
                                      uStack_28cc = uVar103;
                                      uStack_28c8 = uVar103;
                                      uStack_28c4 = uVar103;
                                      local_28c0 = uVar7;
                                      uStack_28bc = uVar7;
                                      uStack_28b8 = uVar7;
                                      uStack_28b4 = uVar7;
                                      uStack_28b0 = uVar7;
                                      uStack_28ac = uVar7;
                                      uStack_28a8 = uVar7;
                                      uStack_28a4 = uVar7;
                                      auVar144 = vpcmpeqd_avx2(local_2900,local_2900);
                                      local_2e50[1] = auVar144;
                                      *local_2e50 = auVar144;
                                      local_28a0 = pRVar11->instID[0];
                                      uStack_289c = local_28a0;
                                      uStack_2898 = local_28a0;
                                      uStack_2894 = local_28a0;
                                      uStack_2890 = local_28a0;
                                      uStack_288c = local_28a0;
                                      uStack_2888 = local_28a0;
                                      uStack_2884 = local_28a0;
                                      local_2880 = pRVar11->instPrimID[0];
                                      uStack_287c = local_2880;
                                      uStack_2878 = local_2880;
                                      uStack_2874 = local_2880;
                                      uStack_2870 = local_2880;
                                      uStack_286c = local_2880;
                                      uStack_2868 = local_2880;
                                      uStack_2864 = local_2880;
                                      local_2f60 = *(undefined1 (*) [32])(ray + 0x100);
                                      auVar144 = vblendvps_avx(local_2f60,local_2e00,auVar126);
                                      *(undefined1 (*) [32])(ray + 0x100) = auVar144;
                                      local_2d80 = auVar126;
                                      local_2ed0.geometryUserPtr = pGVar8->userPtr;
                                      local_2ed0.valid = (int *)local_2d80;
                                      local_2ed0.context = context->user;
                                      local_2ed0.ray = (RTCRayN *)ray;
                                      local_2ed0.hit = local_2980;
                                      local_2ed0.N = 8;
                                      _local_2d40 = auVar193;
                                      _local_2d20 = auVar194;
                                      if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                        auVar184 = ZEXT1632(auVar184._0_16_);
                                        auVar200 = ZEXT1664(auVar109);
                                        auVar205 = ZEXT1664(local_2ce0._0_16_);
                                        in_ZMM14 = ZEXT1664(ZEXT416(0) << 0x20);
                                        (*pGVar8->occlusionFilterN)(&local_2ed0);
                                        auVar212 = ZEXT3264(CONCAT428(0x7f800000,
                                                                      CONCAT424(0x7f800000,
                                                                                CONCAT420(0x7f800000
                                                                                          ,CONCAT416
                                                  (0x7f800000,
                                                   CONCAT412(0x7f800000,
                                                             CONCAT48(0x7f800000,0x7f8000007f800000)
                                                            ))))));
                                        context = local_2f68;
                                      }
                                      auVar126 = vpcmpeqd_avx2(local_2d80,_DAT_01faff00);
                                      auVar177 = vpcmpeqd_avx2(auVar184,auVar184);
                                      auVar144 = auVar177 & ~auVar126;
                                      uVar92 = local_2ea0._0_4_;
                                      uVar90 = local_2e40._0_4_;
                                      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar144 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar144 >> 0x5f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             SUB321(auVar144 >> 0x7f,0) == '\0') &&
                                            (auVar144 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar144 >> 0xbf,0) == '\0') &&
                                          (auVar144 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) && -1 < auVar144[0x1f]) {
                                        auVar126 = auVar126 ^ auVar177;
                                      }
                                      else {
                                        p_Var10 = context->args->filter;
                                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                           (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                          auVar200 = ZEXT1664(auVar200._0_16_);
                                          auVar205 = ZEXT1664(auVar205._0_16_);
                                          in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                          (*p_Var10)(&local_2ed0);
                                          auVar212 = ZEXT3264(CONCAT428(0x7f800000,
                                                                        CONCAT424(0x7f800000,
                                                                                  CONCAT420(
                                                  0x7f800000,
                                                  CONCAT416(0x7f800000,
                                                            CONCAT412(0x7f800000,
                                                                      CONCAT48(0x7f800000,
                                                                               0x7f8000007f800000)))
                                                  ))));
                                          context = local_2f68;
                                          uVar92 = local_2ea0._0_4_;
                                          uVar90 = local_2e40._0_4_;
                                        }
                                        auVar144 = vpcmpeqd_avx2(local_2d80,_DAT_01faff00);
                                        auVar126 = auVar144 ^ _DAT_01fe9960;
                                        auVar177._8_4_ = 0xff800000;
                                        auVar177._0_8_ = 0xff800000ff800000;
                                        auVar177._12_4_ = 0xff800000;
                                        auVar177._16_4_ = 0xff800000;
                                        auVar177._20_4_ = 0xff800000;
                                        auVar177._24_4_ = 0xff800000;
                                        auVar177._28_4_ = 0xff800000;
                                        auVar144 = vblendvps_avx(auVar177,*(undefined1 (*) [32])
                                                                           (local_2ed0.ray + 0x100),
                                                                 auVar144);
                                        *(undefined1 (*) [32])(local_2ed0.ray + 0x100) = auVar144;
                                      }
                                      auVar179 = ZEXT3264(auVar177);
                                      auVar144 = vblendvps_avx(local_2f60,
                                                               *(undefined1 (*) [32])local_2f08,
                                                               auVar126);
                                      *(undefined1 (*) [32])local_2f08 = auVar144;
                                      uVar98 = local_2e80._0_8_;
                                    }
                                    auVar126 = vandnps_avx(auVar126,local_2f40._0_32_);
                                    auVar209 = ZEXT3264(auVar126);
                                    goto LAB_019d8ec0;
                                  }
                                }
                                auVar209 = ZEXT3264(auVar184);
                              }
LAB_019d8ec0:
                              auVar126 = auVar209._0_32_;
                              unaff_R14 = uVar98;
                              if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar126 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar126 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar126 >> 0x7f,0) == '\0')
                                    && (auVar209 & (undefined1  [64])0x100000000) ==
                                       (undefined1  [64])0x0) && SUB321(auVar126 >> 0xbf,0) == '\0')
                                  && (auVar209 & (undefined1  [64])0x100000000) ==
                                     (undefined1  [64])0x0) && -1 < auVar209[0x1f]) break;
                              unaff_R14 = uVar98 + 1;
                              puVar95 = puVar95 + 8;
                            } while (uVar98 < 3);
                            auVar144 = local_2c20 & auVar126;
                            bVar104 = (((((((auVar144 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar144 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar144 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar144 >> 0x7f,0) == '\0') &&
                                        (auVar144 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && SUB321(auVar144 >> 0xbf,0) == '\0'
                                       ) && (auVar144 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) && -1 < auVar144[0x1f];
                            local_2c20 = vandps_avx(auVar126,local_2c20);
                            lVar93 = local_2c50;
                            uVar97 = local_2c48;
                            uVar98 = local_2e48;
                          }
                        } while ((!bVar104) && (uVar97 = uVar97 - 1 & uVar97, uVar97 != 0));
                      }
                      lVar93 = local_2c58 + 1;
                    } while (lVar93 != local_2c60);
                    auVar126 = vpcmpeqd_avx2(auVar179._0_32_,auVar179._0_32_);
                    auVar144 = auVar126 ^ local_2c20;
                  }
                  local_2c40 = vpor_avx2(local_2c40,auVar144);
                  auVar126 = auVar126 & ~local_2c40;
                  if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar126 >> 0x7f,0) == '\0') &&
                        (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar126 >> 0xbf,0) == '\0') &&
                      (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar126[0x1f]) goto LAB_019d9851;
                  auVar178._8_4_ = 0xff800000;
                  auVar178._0_8_ = 0xff800000ff800000;
                  auVar178._12_4_ = 0xff800000;
                  auVar178._16_4_ = 0xff800000;
                  auVar178._20_4_ = 0xff800000;
                  auVar178._24_4_ = 0xff800000;
                  auVar178._28_4_ = 0xff800000;
                  auVar179 = ZEXT3264(auVar178);
                  local_29a0 = vblendvps_avx(local_29a0,auVar178,local_2c40);
                }
                goto LAB_019d7d27;
              }
              uVar96 = 8;
              lVar93 = 0;
              auVar126 = auVar212._0_32_;
              do {
                uVar97 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar93 * 8);
                if (uVar97 == 8) {
                  auVar159 = ZEXT3264(auVar126);
                  break;
                }
                uVar103 = *(undefined4 *)(root.ptr + 0x20 + lVar93 * 4);
                auVar145._4_4_ = uVar103;
                auVar145._0_4_ = uVar103;
                auVar145._8_4_ = uVar103;
                auVar145._12_4_ = uVar103;
                auVar145._16_4_ = uVar103;
                auVar145._20_4_ = uVar103;
                auVar145._24_4_ = uVar103;
                auVar145._28_4_ = uVar103;
                auVar78._8_8_ = local_2b40._8_8_;
                auVar78._0_8_ = local_2b40._0_8_;
                auVar78._16_8_ = local_2b40._16_8_;
                auVar78._24_8_ = local_2b40._24_8_;
                auVar80._8_8_ = local_2b40._40_8_;
                auVar80._0_8_ = local_2b40._32_8_;
                auVar80._16_8_ = local_2b40._48_8_;
                auVar80._24_8_ = local_2b40._56_8_;
                auVar82._8_8_ = local_2b40._72_8_;
                auVar82._0_8_ = local_2b40._64_8_;
                auVar82._16_8_ = local_2b40._80_8_;
                auVar82._24_8_ = local_2b40._88_8_;
                auVar144 = vsubps_avx(auVar145,auVar78);
                auVar179._0_4_ = (float)local_2a80._0_4_ * auVar144._0_4_;
                auVar179._4_4_ = (float)local_2a80._4_4_ * auVar144._4_4_;
                auVar179._8_4_ = fStack_2a78 * auVar144._8_4_;
                auVar179._12_4_ = fStack_2a74 * auVar144._12_4_;
                auVar179._16_4_ = fStack_2a70 * auVar144._16_4_;
                auVar179._20_4_ = fStack_2a6c * auVar144._20_4_;
                auVar179._28_36_ = auVar200._28_36_;
                auVar179._24_4_ = fStack_2a68 * auVar144._24_4_;
                auVar119 = auVar179._0_32_;
                auVar200 = ZEXT3264(auVar119);
                uVar103 = *(undefined4 *)(root.ptr + 0x40 + lVar93 * 4);
                auVar146._4_4_ = uVar103;
                auVar146._0_4_ = uVar103;
                auVar146._8_4_ = uVar103;
                auVar146._12_4_ = uVar103;
                auVar146._16_4_ = uVar103;
                auVar146._20_4_ = uVar103;
                auVar146._24_4_ = uVar103;
                auVar146._28_4_ = uVar103;
                auVar144 = vsubps_avx(auVar146,auVar80);
                auVar159._0_4_ = local_2a60._0_4_ * auVar144._0_4_;
                auVar159._4_4_ = local_2a60._4_4_ * auVar144._4_4_;
                auVar159._8_4_ = local_2a60._8_4_ * auVar144._8_4_;
                auVar159._12_4_ = local_2a60._12_4_ * auVar144._12_4_;
                auVar159._16_4_ = local_2a60._16_4_ * auVar144._16_4_;
                auVar159._20_4_ = local_2a60._20_4_ * auVar144._20_4_;
                auVar159._28_36_ = auVar205._28_36_;
                auVar159._24_4_ = local_2a60._24_4_ * auVar144._24_4_;
                auVar193 = auVar159._0_32_;
                auVar205 = ZEXT3264(auVar193);
                uVar103 = *(undefined4 *)(root.ptr + 0x60 + lVar93 * 4);
                auVar147._4_4_ = uVar103;
                auVar147._0_4_ = uVar103;
                auVar147._8_4_ = uVar103;
                auVar147._12_4_ = uVar103;
                auVar147._16_4_ = uVar103;
                auVar147._20_4_ = uVar103;
                auVar147._24_4_ = uVar103;
                auVar147._28_4_ = uVar103;
                auVar144 = vsubps_avx(auVar147,auVar82);
                auVar210._0_4_ = local_2a40._0_4_ * auVar144._0_4_;
                auVar210._4_4_ = local_2a40._4_4_ * auVar144._4_4_;
                auVar210._8_4_ = local_2a40._8_4_ * auVar144._8_4_;
                auVar210._12_4_ = local_2a40._12_4_ * auVar144._12_4_;
                auVar210._16_4_ = local_2a40._16_4_ * auVar144._16_4_;
                auVar210._20_4_ = local_2a40._20_4_ * auVar144._20_4_;
                auVar210._28_36_ = auVar209._28_36_;
                auVar210._24_4_ = local_2a40._24_4_ * auVar144._24_4_;
                auVar194 = auVar210._0_32_;
                auVar209 = ZEXT3264(auVar194);
                uVar103 = *(undefined4 *)(root.ptr + 0x30 + lVar93 * 4);
                auVar148._4_4_ = uVar103;
                auVar148._0_4_ = uVar103;
                auVar148._8_4_ = uVar103;
                auVar148._12_4_ = uVar103;
                auVar148._16_4_ = uVar103;
                auVar148._20_4_ = uVar103;
                auVar148._24_4_ = uVar103;
                auVar148._28_4_ = uVar103;
                auVar144 = vsubps_avx(auVar148,auVar78);
                auVar19._4_4_ = (float)local_2a80._4_4_ * auVar144._4_4_;
                auVar19._0_4_ = (float)local_2a80._0_4_ * auVar144._0_4_;
                auVar19._8_4_ = fStack_2a78 * auVar144._8_4_;
                auVar19._12_4_ = fStack_2a74 * auVar144._12_4_;
                auVar19._16_4_ = fStack_2a70 * auVar144._16_4_;
                auVar19._20_4_ = fStack_2a6c * auVar144._20_4_;
                auVar19._24_4_ = fStack_2a68 * auVar144._24_4_;
                auVar19._28_4_ = (int)((ulong)local_2b40._24_8_ >> 0x20);
                uVar103 = *(undefined4 *)(root.ptr + 0x50 + lVar93 * 4);
                auVar149._4_4_ = uVar103;
                auVar149._0_4_ = uVar103;
                auVar149._8_4_ = uVar103;
                auVar149._12_4_ = uVar103;
                auVar149._16_4_ = uVar103;
                auVar149._20_4_ = uVar103;
                auVar149._24_4_ = uVar103;
                auVar149._28_4_ = uVar103;
                auVar144 = vsubps_avx(auVar149,auVar80);
                auVar21._4_4_ = local_2a60._4_4_ * auVar144._4_4_;
                auVar21._0_4_ = local_2a60._0_4_ * auVar144._0_4_;
                auVar21._8_4_ = local_2a60._8_4_ * auVar144._8_4_;
                auVar21._12_4_ = local_2a60._12_4_ * auVar144._12_4_;
                auVar21._16_4_ = local_2a60._16_4_ * auVar144._16_4_;
                auVar21._20_4_ = local_2a60._20_4_ * auVar144._20_4_;
                auVar21._24_4_ = local_2a60._24_4_ * auVar144._24_4_;
                auVar21._28_4_ = (int)((ulong)local_2b40._56_8_ >> 0x20);
                uVar103 = *(undefined4 *)(root.ptr + 0x70 + lVar93 * 4);
                auVar150._4_4_ = uVar103;
                auVar150._0_4_ = uVar103;
                auVar150._8_4_ = uVar103;
                auVar150._12_4_ = uVar103;
                auVar150._16_4_ = uVar103;
                auVar150._20_4_ = uVar103;
                auVar150._24_4_ = uVar103;
                auVar150._28_4_ = uVar103;
                auVar144 = vsubps_avx(auVar150,auVar82);
                auVar20._4_4_ = local_2a40._4_4_ * auVar144._4_4_;
                auVar20._0_4_ = local_2a40._0_4_ * auVar144._0_4_;
                auVar20._8_4_ = local_2a40._8_4_ * auVar144._8_4_;
                auVar20._12_4_ = local_2a40._12_4_ * auVar144._12_4_;
                auVar20._16_4_ = local_2a40._16_4_ * auVar144._16_4_;
                auVar20._20_4_ = local_2a40._20_4_ * auVar144._20_4_;
                auVar20._24_4_ = local_2a40._24_4_ * auVar144._24_4_;
                auVar20._28_4_ = (int)((ulong)local_2b40._88_8_ >> 0x20);
                auVar144 = vminps_avx(auVar119,auVar19);
                auVar184 = vminps_avx(auVar193,auVar21);
                auVar144 = vmaxps_avx(auVar144,auVar184);
                auVar184 = vminps_avx(auVar194,auVar20);
                auVar144 = vmaxps_avx(auVar144,auVar184);
                auVar23._4_4_ = auVar144._4_4_ * 0.99999964;
                auVar23._0_4_ = auVar144._0_4_ * 0.99999964;
                auVar23._8_4_ = auVar144._8_4_ * 0.99999964;
                auVar23._12_4_ = auVar144._12_4_ * 0.99999964;
                auVar23._16_4_ = auVar144._16_4_ * 0.99999964;
                auVar23._20_4_ = auVar144._20_4_ * 0.99999964;
                auVar23._24_4_ = auVar144._24_4_ * 0.99999964;
                auVar23._28_4_ = auVar144._28_4_;
                auVar144 = vmaxps_avx(auVar119,auVar19);
                auVar184 = vmaxps_avx(auVar193,auVar21);
                auVar184 = vminps_avx(auVar144,auVar184);
                auVar144 = vmaxps_avx(auVar194,auVar20);
                auVar144 = vminps_avx(auVar184,auVar144);
                auVar24._4_4_ = auVar144._4_4_ * 1.0000004;
                auVar24._0_4_ = auVar144._0_4_ * 1.0000004;
                auVar24._8_4_ = auVar144._8_4_ * 1.0000004;
                auVar24._12_4_ = auVar144._12_4_ * 1.0000004;
                auVar24._16_4_ = auVar144._16_4_ * 1.0000004;
                auVar24._20_4_ = auVar144._20_4_ * 1.0000004;
                auVar24._24_4_ = auVar144._24_4_ * 1.0000004;
                auVar24._28_4_ = auVar144._28_4_;
                auVar144 = vmaxps_avx(auVar23,local_29c0);
                auVar184 = vminps_avx(auVar24,local_29a0);
                auVar144 = vcmpps_avx(auVar144,auVar184,2);
                auVar179 = ZEXT3264(auVar144);
                if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar144 >> 0x7f,0) == '\0') &&
                      (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar144 >> 0xbf,0) == '\0') &&
                    (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar144[0x1f]) {
                  auVar159 = ZEXT3264(auVar126);
                  uVar97 = uVar96;
                }
                else {
                  auVar144 = vblendvps_avx(auVar212._0_32_,auVar23,auVar144);
                  auVar159 = ZEXT3264(auVar144);
                  if (uVar96 != 8) {
                    *puVar102 = uVar96;
                    puVar102 = puVar102 + 1;
                    *pauVar101 = auVar126;
                    pauVar101 = pauVar101 + 1;
                  }
                }
                uVar96 = uVar97;
                lVar93 = lVar93 + 1;
                auVar126 = auVar159._0_32_;
              } while (lVar93 != 4);
              iVar88 = 4;
              if (uVar96 == 8) goto LAB_019d7ef1;
              auVar126 = vcmpps_avx(local_29a0,auVar159._0_32_,6);
              uVar103 = vmovmskps_avx(auVar126);
              root.ptr = uVar96;
            } while ((byte)uVar98 < (byte)POPCOUNT(uVar103));
            *puVar102 = uVar96;
            puVar102 = puVar102 + 1;
            *pauVar101 = auVar159._0_32_;
            pauVar101 = pauVar101 + 1;
          }
          else {
            for (; unaff_R14 != 0; unaff_R14 = unaff_R14 - 1 & unaff_R14) {
              k = 0;
              for (uVar98 = unaff_R14; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000)
              {
                k = k + 1;
              }
              local_2f40._0_8_ = k;
              auVar179 = ZEXT1664(auVar179._0_16_);
              auVar200 = ZEXT1664(auVar200._0_16_);
              auVar205 = ZEXT1664(auVar205._0_16_);
              auVar209 = ZEXT1664(auVar209._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              bVar104 = occluded1(local_2c68,local_2c70,root,k,&local_2f69,ray,
                                  (TravRayK<8,_true> *)&local_2b40.field_0,context);
              if (bVar104) {
                *(undefined4 *)(local_2c40 + local_2f40._0_8_ * 4) = 0xffffffff;
              }
              uVar98 = local_2e48;
              context = local_2f68;
            }
            auVar126 = _DAT_01fe9960 & ~local_2c40;
            if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar126 >> 0x7f,0) == '\0') &&
                  (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar126 >> 0xbf,0) == '\0') &&
                (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar126[0x1f]) {
              iVar88 = 3;
            }
            else {
              auVar126._8_4_ = 0xff800000;
              auVar126._0_8_ = 0xff800000ff800000;
              auVar126._12_4_ = 0xff800000;
              auVar126._16_4_ = 0xff800000;
              auVar126._20_4_ = 0xff800000;
              auVar126._24_4_ = 0xff800000;
              auVar126._28_4_ = 0xff800000;
              auVar179 = ZEXT3264(auVar126);
              local_29a0 = vblendvps_avx(local_29a0,auVar126,local_2c40);
              iVar88 = 2;
            }
            auVar212 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar159 = ZEXT3264(local_2f60);
            unaff_R14 = 0;
            if ((uint)uVar98 < (uint)POPCOUNT(uVar103)) goto LAB_019d7d66;
          }
LAB_019d7ef1:
        } while ((iVar88 == 4) || (iVar88 == 2));
LAB_019d9851:
        auVar126 = vandps_avx(local_2760,local_2c40);
        auVar158._8_4_ = 0xff800000;
        auVar158._0_8_ = 0xff800000ff800000;
        auVar158._12_4_ = 0xff800000;
        auVar158._16_4_ = 0xff800000;
        auVar158._20_4_ = 0xff800000;
        auVar158._24_4_ = 0xff800000;
        auVar158._28_4_ = 0xff800000;
        auVar126 = vmaskmovps_avx(auVar126,auVar158);
        *(undefined1 (*) [32])local_2f08 = auVar126;
        return;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }